

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  byte bVar66;
  uint uVar67;
  uint uVar68;
  long lVar69;
  uint uVar70;
  float fVar71;
  float fVar110;
  float fVar112;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar111;
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar86 [16];
  float fVar113;
  float fVar114;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar115;
  vint4 bi;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar125 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 bi_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar179;
  float fVar194;
  float fVar196;
  vint4 ai_1;
  undefined1 auVar180 [16];
  float fVar198;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar200;
  undefined1 auVar193 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar223;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar204 [16];
  float fVar228;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar229;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar230;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar245;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  vint4 ai;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  float fVar272;
  float fVar288;
  float fVar289;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar290;
  float fVar291;
  undefined1 auVar287 [32];
  float fVar292;
  float fVar302;
  float fVar303;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar300 [32];
  float fVar304;
  undefined1 auVar301 [32];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  float fVar326;
  float fVar335;
  float fVar336;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar337;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar346;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar353 [64];
  float fVar358;
  vfloat4 a0;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  uint auStack_460 [4];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar257 [32];
  undefined1 auVar352 [32];
  
  PVar6 = prim[1];
  uVar63 = (ulong)(byte)PVar6;
  lVar64 = uVar63 * 0x25;
  fVar115 = *(float *)(prim + lVar64 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar209 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar209 = vinsertps_avx(auVar209,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar90 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar64 + 6));
  auVar116._0_4_ = fVar115 * auVar90._0_4_;
  auVar116._4_4_ = fVar115 * auVar90._4_4_;
  auVar116._8_4_ = fVar115 * auVar90._8_4_;
  auVar116._12_4_ = fVar115 * auVar90._12_4_;
  auVar259._0_4_ = fVar115 * auVar209._0_4_;
  auVar259._4_4_ = fVar115 * auVar209._4_4_;
  auVar259._8_4_ = fVar115 * auVar209._8_4_;
  auVar259._12_4_ = fVar115 * auVar209._12_4_;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar282 = vcvtdq2ps_avx(auVar282);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar63 + 6)));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar160 = vshufps_avx(auVar259,auVar259,0);
  auVar128 = vshufps_avx(auVar259,auVar259,0x55);
  auVar258 = vshufps_avx(auVar259,auVar259,0xaa);
  fVar115 = auVar258._0_4_;
  fVar71 = auVar258._4_4_;
  fVar110 = auVar258._8_4_;
  fVar112 = auVar258._12_4_;
  fVar201 = auVar128._0_4_;
  fVar223 = auVar128._4_4_;
  fVar225 = auVar128._8_4_;
  fVar228 = auVar128._12_4_;
  fVar178 = auVar160._0_4_;
  fVar194 = auVar160._4_4_;
  fVar196 = auVar160._8_4_;
  fVar198 = auVar160._12_4_;
  auVar327._0_4_ = fVar178 * auVar90._0_4_ + fVar201 * auVar209._0_4_ + fVar115 * auVar174._0_4_;
  auVar327._4_4_ = fVar194 * auVar90._4_4_ + fVar223 * auVar209._4_4_ + fVar71 * auVar174._4_4_;
  auVar327._8_4_ = fVar196 * auVar90._8_4_ + fVar225 * auVar209._8_4_ + fVar110 * auVar174._8_4_;
  auVar327._12_4_ = fVar198 * auVar90._12_4_ + fVar228 * auVar209._12_4_ + fVar112 * auVar174._12_4_
  ;
  auVar342._0_4_ = fVar178 * auVar282._0_4_ + fVar201 * auVar249._0_4_ + auVar14._0_4_ * fVar115;
  auVar342._4_4_ = fVar194 * auVar282._4_4_ + fVar223 * auVar249._4_4_ + auVar14._4_4_ * fVar71;
  auVar342._8_4_ = fVar196 * auVar282._8_4_ + fVar225 * auVar249._8_4_ + auVar14._8_4_ * fVar110;
  auVar342._12_4_ = fVar198 * auVar282._12_4_ + fVar228 * auVar249._12_4_ + auVar14._12_4_ * fVar112
  ;
  auVar260._0_4_ = fVar178 * auVar15._0_4_ + fVar201 * auVar139._0_4_ + auVar127._0_4_ * fVar115;
  auVar260._4_4_ = fVar194 * auVar15._4_4_ + fVar223 * auVar139._4_4_ + auVar127._4_4_ * fVar71;
  auVar260._8_4_ = fVar196 * auVar15._8_4_ + fVar225 * auVar139._8_4_ + auVar127._8_4_ * fVar110;
  auVar260._12_4_ = fVar198 * auVar15._12_4_ + fVar228 * auVar139._12_4_ + auVar127._12_4_ * fVar112
  ;
  auVar160 = vshufps_avx(auVar116,auVar116,0);
  auVar128 = vshufps_avx(auVar116,auVar116,0x55);
  auVar258 = vshufps_avx(auVar116,auVar116,0xaa);
  fVar115 = auVar258._0_4_;
  fVar71 = auVar258._4_4_;
  fVar110 = auVar258._8_4_;
  fVar112 = auVar258._12_4_;
  fVar201 = auVar128._0_4_;
  fVar223 = auVar128._4_4_;
  fVar225 = auVar128._8_4_;
  fVar228 = auVar128._12_4_;
  fVar178 = auVar160._0_4_;
  fVar194 = auVar160._4_4_;
  fVar196 = auVar160._8_4_;
  fVar198 = auVar160._12_4_;
  auVar117._0_4_ = fVar178 * auVar90._0_4_ + fVar201 * auVar209._0_4_ + fVar115 * auVar174._0_4_;
  auVar117._4_4_ = fVar194 * auVar90._4_4_ + fVar223 * auVar209._4_4_ + fVar71 * auVar174._4_4_;
  auVar117._8_4_ = fVar196 * auVar90._8_4_ + fVar225 * auVar209._8_4_ + fVar110 * auVar174._8_4_;
  auVar117._12_4_ = fVar198 * auVar90._12_4_ + fVar228 * auVar209._12_4_ + fVar112 * auVar174._12_4_
  ;
  auVar72._0_4_ = fVar178 * auVar282._0_4_ + auVar14._0_4_ * fVar115 + fVar201 * auVar249._0_4_;
  auVar72._4_4_ = fVar194 * auVar282._4_4_ + auVar14._4_4_ * fVar71 + fVar223 * auVar249._4_4_;
  auVar72._8_4_ = fVar196 * auVar282._8_4_ + auVar14._8_4_ * fVar110 + fVar225 * auVar249._8_4_;
  auVar72._12_4_ = fVar198 * auVar282._12_4_ + auVar14._12_4_ * fVar112 + fVar228 * auVar249._12_4_;
  auVar273._8_4_ = 0x7fffffff;
  auVar273._0_8_ = 0x7fffffff7fffffff;
  auVar273._12_4_ = 0x7fffffff;
  auVar90 = vandps_avx(auVar327,auVar273);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  auVar90 = vcmpps_avx(auVar90,auVar204,1);
  auVar209 = vblendvps_avx(auVar327,auVar204,auVar90);
  auVar90 = vandps_avx(auVar342,auVar273);
  auVar90 = vcmpps_avx(auVar90,auVar204,1);
  auVar174 = vblendvps_avx(auVar342,auVar204,auVar90);
  auVar90 = vandps_avx(auVar273,auVar260);
  auVar90 = vcmpps_avx(auVar90,auVar204,1);
  auVar90 = vblendvps_avx(auVar260,auVar204,auVar90);
  auVar147._0_4_ = fVar178 * auVar15._0_4_ + fVar201 * auVar139._0_4_ + auVar127._0_4_ * fVar115;
  auVar147._4_4_ = fVar194 * auVar15._4_4_ + fVar223 * auVar139._4_4_ + auVar127._4_4_ * fVar71;
  auVar147._8_4_ = fVar196 * auVar15._8_4_ + fVar225 * auVar139._8_4_ + auVar127._8_4_ * fVar110;
  auVar147._12_4_ = fVar198 * auVar15._12_4_ + fVar228 * auVar139._12_4_ + auVar127._12_4_ * fVar112
  ;
  auVar282 = vrcpps_avx(auVar209);
  fVar178 = auVar282._0_4_;
  auVar180._0_4_ = fVar178 * auVar209._0_4_;
  fVar194 = auVar282._4_4_;
  auVar180._4_4_ = fVar194 * auVar209._4_4_;
  fVar196 = auVar282._8_4_;
  auVar180._8_4_ = fVar196 * auVar209._8_4_;
  fVar198 = auVar282._12_4_;
  auVar180._12_4_ = fVar198 * auVar209._12_4_;
  auVar274._8_4_ = 0x3f800000;
  auVar274._0_8_ = 0x3f8000003f800000;
  auVar274._12_4_ = 0x3f800000;
  auVar209 = vsubps_avx(auVar274,auVar180);
  fVar178 = fVar178 + fVar178 * auVar209._0_4_;
  fVar194 = fVar194 + fVar194 * auVar209._4_4_;
  fVar196 = fVar196 + fVar196 * auVar209._8_4_;
  fVar198 = fVar198 + fVar198 * auVar209._12_4_;
  auVar209 = vrcpps_avx(auVar174);
  fVar201 = auVar209._0_4_;
  auVar231._0_4_ = fVar201 * auVar174._0_4_;
  fVar223 = auVar209._4_4_;
  auVar231._4_4_ = fVar223 * auVar174._4_4_;
  fVar225 = auVar209._8_4_;
  auVar231._8_4_ = fVar225 * auVar174._8_4_;
  fVar228 = auVar209._12_4_;
  auVar231._12_4_ = fVar228 * auVar174._12_4_;
  auVar209 = vsubps_avx(auVar274,auVar231);
  fVar201 = fVar201 + fVar201 * auVar209._0_4_;
  fVar223 = fVar223 + fVar223 * auVar209._4_4_;
  fVar225 = fVar225 + fVar225 * auVar209._8_4_;
  fVar228 = fVar228 + fVar228 * auVar209._12_4_;
  auVar209 = vrcpps_avx(auVar90);
  fVar230 = auVar209._0_4_;
  auVar246._0_4_ = fVar230 * auVar90._0_4_;
  fVar242 = auVar209._4_4_;
  auVar246._4_4_ = fVar242 * auVar90._4_4_;
  fVar243 = auVar209._8_4_;
  auVar246._8_4_ = fVar243 * auVar90._8_4_;
  fVar244 = auVar209._12_4_;
  auVar246._12_4_ = fVar244 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar274,auVar246);
  fVar230 = fVar230 + fVar230 * auVar90._0_4_;
  fVar242 = fVar242 + fVar242 * auVar90._4_4_;
  fVar243 = fVar243 + fVar243 * auVar90._8_4_;
  fVar244 = fVar244 + fVar244 * auVar90._12_4_;
  auVar90 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar64 + 0x16)) *
                          *(float *)(prim + lVar64 + 0x1a)));
  auVar174 = vshufps_avx(auVar90,auVar90,0);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar209 = vpmovsxwd_avx(auVar209);
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar282 = vsubps_avx(auVar209,auVar90);
  fVar115 = auVar174._0_4_;
  fVar71 = auVar174._4_4_;
  fVar110 = auVar174._8_4_;
  fVar112 = auVar174._12_4_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar209 = vpmovsxwd_avx(auVar174);
  auVar261._0_4_ = auVar282._0_4_ * fVar115 + auVar90._0_4_;
  auVar261._4_4_ = auVar282._4_4_ * fVar71 + auVar90._4_4_;
  auVar261._8_4_ = auVar282._8_4_ * fVar110 + auVar90._8_4_;
  auVar261._12_4_ = auVar282._12_4_ * fVar112 + auVar90._12_4_;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar174 = vpmovsxwd_avx(auVar282);
  auVar90 = vcvtdq2ps_avx(auVar209);
  auVar209 = vcvtdq2ps_avx(auVar174);
  auVar209 = vsubps_avx(auVar209,auVar90);
  auVar275._0_4_ = auVar209._0_4_ * fVar115 + auVar90._0_4_;
  auVar275._4_4_ = auVar209._4_4_ * fVar71 + auVar90._4_4_;
  auVar275._8_4_ = auVar209._8_4_ * fVar110 + auVar90._8_4_;
  auVar275._12_4_ = auVar209._12_4_ * fVar112 + auVar90._12_4_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar249);
  uVar65 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar65 + 6);
  auVar209 = vpmovsxwd_avx(auVar14);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar209 = vsubps_avx(auVar209,auVar90);
  auVar293._0_4_ = auVar209._0_4_ * fVar115 + auVar90._0_4_;
  auVar293._4_4_ = auVar209._4_4_ * fVar71 + auVar90._4_4_;
  auVar293._8_4_ = auVar209._8_4_ * fVar110 + auVar90._8_4_;
  auVar293._12_4_ = auVar209._12_4_ * fVar112 + auVar90._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar90 = vpmovsxwd_avx(auVar15);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar209 = vpmovsxwd_avx(auVar139);
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar174 = vsubps_avx(auVar209,auVar90);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar209 = vpmovsxwd_avx(auVar127);
  auVar308._0_4_ = auVar174._0_4_ * fVar115 + auVar90._0_4_;
  auVar308._4_4_ = auVar174._4_4_ * fVar71 + auVar90._4_4_;
  auVar308._8_4_ = auVar174._8_4_ * fVar110 + auVar90._8_4_;
  auVar308._12_4_ = auVar174._12_4_ * fVar112 + auVar90._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar209);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar209 = vpmovsxwd_avx(auVar160);
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar209 = vsubps_avx(auVar209,auVar90);
  auVar319._0_4_ = auVar209._0_4_ * fVar115 + auVar90._0_4_;
  auVar319._4_4_ = auVar209._4_4_ * fVar71 + auVar90._4_4_;
  auVar319._8_4_ = auVar209._8_4_ * fVar110 + auVar90._8_4_;
  auVar319._12_4_ = auVar209._12_4_ * fVar112 + auVar90._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar63) + 6);
  auVar90 = vpmovsxwd_avx(auVar128);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar209 = vpmovsxwd_avx(auVar258);
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar209 = vsubps_avx(auVar209,auVar90);
  auVar247._0_4_ = auVar90._0_4_ + auVar209._0_4_ * fVar115;
  auVar247._4_4_ = auVar90._4_4_ + auVar209._4_4_ * fVar71;
  auVar247._8_4_ = auVar90._8_4_ + auVar209._8_4_ * fVar110;
  auVar247._12_4_ = auVar90._12_4_ + auVar209._12_4_ * fVar112;
  auVar90 = vsubps_avx(auVar261,auVar117);
  auVar262._0_4_ = fVar178 * auVar90._0_4_;
  auVar262._4_4_ = fVar194 * auVar90._4_4_;
  auVar262._8_4_ = fVar196 * auVar90._8_4_;
  auVar262._12_4_ = fVar198 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar275,auVar117);
  auVar118._0_4_ = fVar178 * auVar90._0_4_;
  auVar118._4_4_ = fVar194 * auVar90._4_4_;
  auVar118._8_4_ = fVar196 * auVar90._8_4_;
  auVar118._12_4_ = fVar198 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar293,auVar72);
  auVar181._0_4_ = fVar201 * auVar90._0_4_;
  auVar181._4_4_ = fVar223 * auVar90._4_4_;
  auVar181._8_4_ = fVar225 * auVar90._8_4_;
  auVar181._12_4_ = fVar228 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar308,auVar72);
  auVar73._0_4_ = fVar201 * auVar90._0_4_;
  auVar73._4_4_ = fVar223 * auVar90._4_4_;
  auVar73._8_4_ = fVar225 * auVar90._8_4_;
  auVar73._12_4_ = fVar228 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar319,auVar147);
  auVar205._0_4_ = fVar230 * auVar90._0_4_;
  auVar205._4_4_ = fVar242 * auVar90._4_4_;
  auVar205._8_4_ = fVar243 * auVar90._8_4_;
  auVar205._12_4_ = fVar244 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar247,auVar147);
  auVar148._0_4_ = fVar230 * auVar90._0_4_;
  auVar148._4_4_ = fVar242 * auVar90._4_4_;
  auVar148._8_4_ = fVar243 * auVar90._8_4_;
  auVar148._12_4_ = fVar244 * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar262,auVar118);
  auVar209 = vpminsd_avx(auVar181,auVar73);
  auVar90 = vmaxps_avx(auVar90,auVar209);
  auVar209 = vpminsd_avx(auVar205,auVar148);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar276._4_4_ = uVar4;
  auVar276._0_4_ = uVar4;
  auVar276._8_4_ = uVar4;
  auVar276._12_4_ = uVar4;
  auVar209 = vmaxps_avx(auVar209,auVar276);
  auVar90 = vmaxps_avx(auVar90,auVar209);
  local_450._0_4_ = auVar90._0_4_ * 0.99999964;
  local_450._4_4_ = auVar90._4_4_ * 0.99999964;
  local_450._8_4_ = auVar90._8_4_ * 0.99999964;
  local_450._12_4_ = auVar90._12_4_ * 0.99999964;
  auVar90 = vpmaxsd_avx(auVar262,auVar118);
  auVar209 = vpmaxsd_avx(auVar181,auVar73);
  auVar90 = vminps_avx(auVar90,auVar209);
  auVar209 = vpmaxsd_avx(auVar205,auVar148);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar149._4_4_ = uVar4;
  auVar149._0_4_ = uVar4;
  auVar149._8_4_ = uVar4;
  auVar149._12_4_ = uVar4;
  auVar209 = vminps_avx(auVar209,auVar149);
  auVar90 = vminps_avx(auVar90,auVar209);
  auVar74._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar90 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar209 = vpcmpgtd_avx(auVar90,_DAT_01f7fcf0);
  auVar90 = vcmpps_avx(local_450,auVar74,2);
  auVar90 = vandps_avx(auVar90,auVar209);
  uVar61 = vmovmskps_avx(auVar90);
  if (uVar61 == 0) {
    return;
  }
  uVar61 = uVar61 & 0xff;
  auVar102._16_16_ = mm_lookupmask_ps._240_16_;
  auVar102._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar102,ZEXT832(0) << 0x20,0x80);
  uVar67 = 1 << ((byte)k & 0x1f);
  auVar53 = ZEXT412(0);
  do {
    auVar55._12_4_ = 0;
    auVar55._0_12_ = auVar53;
    lVar64 = 0;
    if (uVar61 != 0) {
      for (; (uVar61 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
      }
    }
    uVar62 = *(uint *)(prim + 2);
    pGVar8 = (context->scene->geometries).items[uVar62].ptr;
    fVar115 = (pGVar8->time_range).lower;
    fVar115 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar115) / ((pGVar8->time_range).upper - fVar115));
    auVar90 = vroundss_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),9);
    auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar90 = vmaxss_avx(auVar55 << 0x20,auVar90);
    uVar7 = *(uint *)(prim + lVar64 * 4 + 6);
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)uVar7 *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar69 = (long)(int)auVar90._0_4_ * 0x38;
    lVar10 = *(long *)(_Var9 + lVar69);
    lVar11 = *(long *)(_Var9 + 0x10 + lVar69);
    pfVar3 = (float *)(lVar10 + lVar11 * uVar63);
    fVar71 = *pfVar3;
    fVar110 = pfVar3[1];
    fVar112 = pfVar3[2];
    fVar178 = pfVar3[3];
    lVar64 = uVar63 + 1;
    pfVar3 = (float *)(lVar10 + lVar11 * lVar64);
    fVar194 = *pfVar3;
    fVar196 = pfVar3[1];
    fVar198 = pfVar3[2];
    fVar201 = pfVar3[3];
    lVar1 = uVar63 + 2;
    pfVar3 = (float *)(lVar10 + lVar11 * lVar1);
    fVar223 = *pfVar3;
    fVar225 = pfVar3[1];
    fVar228 = pfVar3[2];
    fVar230 = pfVar3[3];
    lVar2 = uVar63 + 3;
    pfVar3 = (float *)(lVar10 + lVar11 * lVar2);
    fVar242 = *pfVar3;
    fVar243 = pfVar3[1];
    fVar244 = pfVar3[2];
    fVar111 = pfVar3[3];
    lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar10 + lVar69);
    lVar12 = *(long *)(lVar10 + 0x10 + lVar69);
    pfVar3 = (float *)(lVar11 + lVar12 * uVar63);
    fVar179 = *pfVar3;
    fVar195 = pfVar3[1];
    fVar197 = pfVar3[2];
    fVar199 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar64);
    fVar202 = *pfVar3;
    fVar224 = pfVar3[1];
    fVar226 = pfVar3[2];
    fVar229 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
    fVar113 = *pfVar3;
    fVar114 = pfVar3[1];
    fVar200 = pfVar3[2];
    fVar245 = pfVar3[3];
    fVar115 = fVar115 - auVar90._0_4_;
    pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
    fVar203 = *pfVar3;
    fVar272 = pfVar3[1];
    fVar227 = pfVar3[2];
    fVar288 = pfVar3[3];
    auVar75._0_4_ = fVar194 * 0.0 + fVar223 * 0.5 + fVar242 * 0.0;
    auVar75._4_4_ = fVar196 * 0.0 + fVar225 * 0.5 + fVar243 * 0.0;
    auVar75._8_4_ = fVar198 * 0.0 + fVar228 * 0.5 + fVar244 * 0.0;
    auVar75._12_4_ = fVar201 * 0.0 + fVar230 * 0.5 + fVar111 * 0.0;
    auVar150._0_4_ = fVar71 * 0.5;
    auVar150._4_4_ = fVar110 * 0.5;
    auVar150._8_4_ = fVar112 * 0.5;
    auVar150._12_4_ = fVar178 * 0.5;
    auVar139 = vsubps_avx(auVar75,auVar150);
    auVar76._0_4_ = fVar202 * 0.0 + fVar113 * 0.5 + fVar203 * 0.0;
    auVar76._4_4_ = fVar224 * 0.0 + fVar114 * 0.5 + fVar272 * 0.0;
    auVar76._8_4_ = fVar226 * 0.0 + fVar200 * 0.5 + fVar227 * 0.0;
    auVar76._12_4_ = fVar229 * 0.0 + fVar245 * 0.5 + fVar288 * 0.0;
    auVar347._0_4_ = fVar179 * 0.5;
    auVar347._4_4_ = fVar195 * 0.5;
    auVar347._8_4_ = fVar197 * 0.5;
    auVar347._12_4_ = fVar199 * 0.5;
    auVar282 = vsubps_avx(auVar76,auVar347);
    local_6e0._0_4_ = fVar71 * -0.0 + fVar223 * 0.0 + fVar242 * -0.0 + fVar194;
    local_6e0._4_4_ = fVar110 * -0.0 + fVar225 * 0.0 + fVar243 * -0.0 + fVar196;
    fStack_6d8 = fVar112 * -0.0 + fVar228 * 0.0 + fVar244 * -0.0 + fVar198;
    fStack_6d4 = fVar178 * -0.0 + fVar230 * 0.0 + fVar111 * -0.0 + fVar201;
    local_5f0._0_4_ = fVar71 * -0.0 + fVar194 * 0.0 + fVar223 + fVar242 * -0.0;
    local_5f0._4_4_ = fVar110 * -0.0 + fVar196 * 0.0 + fVar225 + fVar243 * -0.0;
    fStack_5e8 = fVar112 * -0.0 + fVar198 * 0.0 + fVar228 + fVar244 * -0.0;
    fStack_5e4 = fVar178 * -0.0 + fVar201 * 0.0 + fVar230 + fVar111 * -0.0;
    auVar277._0_4_ = fVar223 * 0.0 + fVar242 * 0.5;
    auVar277._4_4_ = fVar225 * 0.0 + fVar243 * 0.5;
    auVar277._8_4_ = fVar228 * 0.0 + fVar244 * 0.5;
    auVar277._12_4_ = fVar230 * 0.0 + fVar111 * 0.5;
    auVar206._0_4_ = fVar194 * 0.5;
    auVar206._4_4_ = fVar196 * 0.5;
    auVar206._8_4_ = fVar198 * 0.5;
    auVar206._12_4_ = fVar201 * 0.5;
    auVar90 = vsubps_avx(auVar277,auVar206);
    auVar354._0_4_ = fVar179 * -0.0 + fVar113 * 0.0 + fVar203 * -0.0 + fVar202;
    auVar354._4_4_ = fVar195 * -0.0 + fVar114 * 0.0 + fVar272 * -0.0 + fVar224;
    auVar354._8_4_ = fVar197 * -0.0 + fVar200 * 0.0 + fVar227 * -0.0 + fVar226;
    auVar354._12_4_ = fVar199 * -0.0 + fVar245 * 0.0 + fVar288 * -0.0 + fVar229;
    auVar294._0_4_ = fVar71 * 0.0 + auVar90._0_4_;
    auVar294._4_4_ = fVar110 * 0.0 + auVar90._4_4_;
    auVar294._8_4_ = fVar112 * 0.0 + auVar90._8_4_;
    auVar294._12_4_ = fVar178 * 0.0 + auVar90._12_4_;
    auVar182._0_4_ = fVar179 * -0.0 + fVar202 * 0.0 + fVar113 + fVar203 * -0.0;
    auVar182._4_4_ = fVar195 * -0.0 + fVar224 * 0.0 + fVar114 + fVar272 * -0.0;
    auVar182._8_4_ = fVar197 * -0.0 + fVar226 * 0.0 + fVar200 + fVar227 * -0.0;
    auVar182._12_4_ = fVar199 * -0.0 + fVar229 * 0.0 + fVar245 + fVar288 * -0.0;
    auVar207._0_4_ = fVar113 * 0.0 + fVar203 * 0.5;
    auVar207._4_4_ = fVar114 * 0.0 + fVar272 * 0.5;
    auVar207._8_4_ = fVar200 * 0.0 + fVar227 * 0.5;
    auVar207._12_4_ = fVar245 * 0.0 + fVar288 * 0.5;
    auVar263._0_4_ = fVar202 * 0.5;
    auVar263._4_4_ = fVar224 * 0.5;
    auVar263._8_4_ = fVar226 * 0.5;
    auVar263._12_4_ = fVar229 * 0.5;
    auVar90 = vsubps_avx(auVar207,auVar263);
    auVar208._0_4_ = fVar179 * 0.0 + auVar90._0_4_;
    auVar208._4_4_ = fVar195 * 0.0 + auVar90._4_4_;
    auVar208._8_4_ = fVar197 * 0.0 + auVar90._8_4_;
    auVar208._12_4_ = fVar199 * 0.0 + auVar90._12_4_;
    auVar90 = vshufps_avx(auVar139,auVar139,0xc9);
    auVar209 = vshufps_avx(auVar354,auVar354,0xc9);
    fVar326 = auVar139._0_4_;
    auVar232._0_4_ = fVar326 * auVar209._0_4_;
    fVar289 = auVar139._4_4_;
    auVar232._4_4_ = fVar289 * auVar209._4_4_;
    fVar335 = auVar139._8_4_;
    auVar232._8_4_ = fVar335 * auVar209._8_4_;
    fVar290 = auVar139._12_4_;
    auVar232._12_4_ = fVar290 * auVar209._12_4_;
    auVar278._0_4_ = auVar354._0_4_ * auVar90._0_4_;
    auVar278._4_4_ = auVar354._4_4_ * auVar90._4_4_;
    auVar278._8_4_ = auVar354._8_4_ * auVar90._8_4_;
    auVar278._12_4_ = auVar354._12_4_ * auVar90._12_4_;
    auVar209 = vsubps_avx(auVar278,auVar232);
    auVar174 = vshufps_avx(auVar209,auVar209,0xc9);
    auVar209 = vshufps_avx(auVar282,auVar282,0xc9);
    auVar279._0_4_ = auVar209._0_4_ * fVar326;
    auVar279._4_4_ = auVar209._4_4_ * fVar289;
    auVar279._8_4_ = auVar209._8_4_ * fVar335;
    auVar279._12_4_ = auVar209._12_4_ * fVar290;
    auVar77._0_4_ = auVar90._0_4_ * auVar282._0_4_;
    auVar77._4_4_ = auVar90._4_4_ * auVar282._4_4_;
    auVar77._8_4_ = auVar90._8_4_ * auVar282._8_4_;
    auVar77._12_4_ = auVar90._12_4_ * auVar282._12_4_;
    auVar90 = vsubps_avx(auVar77,auVar279);
    auVar282 = vshufps_avx(auVar90,auVar90,0xc9);
    auVar90 = vshufps_avx(auVar294,auVar294,0xc9);
    auVar209 = vshufps_avx(auVar182,auVar182,0xc9);
    auVar280._0_4_ = auVar294._0_4_ * auVar209._0_4_;
    auVar280._4_4_ = auVar294._4_4_ * auVar209._4_4_;
    auVar280._8_4_ = auVar294._8_4_ * auVar209._8_4_;
    auVar280._12_4_ = auVar294._12_4_ * auVar209._12_4_;
    auVar183._0_4_ = auVar90._0_4_ * auVar182._0_4_;
    auVar183._4_4_ = auVar90._4_4_ * auVar182._4_4_;
    auVar183._8_4_ = auVar90._8_4_ * auVar182._8_4_;
    auVar183._12_4_ = auVar90._12_4_ * auVar182._12_4_;
    auVar209 = vsubps_avx(auVar183,auVar280);
    auVar249 = vshufps_avx(auVar209,auVar209,0xc9);
    auVar209 = vshufps_avx(auVar208,auVar208,0xc9);
    auVar281._0_4_ = auVar294._0_4_ * auVar209._0_4_;
    auVar281._4_4_ = auVar294._4_4_ * auVar209._4_4_;
    auVar281._8_4_ = auVar294._8_4_ * auVar209._8_4_;
    auVar281._12_4_ = auVar294._12_4_ * auVar209._12_4_;
    auVar78._0_4_ = auVar90._0_4_ * auVar208._0_4_;
    auVar78._4_4_ = auVar90._4_4_ * auVar208._4_4_;
    auVar78._8_4_ = auVar90._8_4_ * auVar208._8_4_;
    auVar78._12_4_ = auVar90._12_4_ * auVar208._12_4_;
    auVar90 = vdpps_avx(auVar174,auVar174,0x7f);
    auVar209 = vsubps_avx(auVar78,auVar281);
    auVar14 = vshufps_avx(auVar209,auVar209,0xc9);
    fVar110 = auVar90._0_4_;
    auVar160 = ZEXT416((uint)fVar110);
    auVar209 = vrsqrtss_avx(auVar160,auVar160);
    fVar71 = auVar209._0_4_;
    auVar209 = ZEXT416((uint)(fVar71 * 1.5 - fVar110 * 0.5 * fVar71 * fVar71 * fVar71));
    auVar15 = vshufps_avx(auVar209,auVar209,0);
    fVar202 = auVar15._0_4_ * auVar174._0_4_;
    fVar224 = auVar15._4_4_ * auVar174._4_4_;
    fVar226 = auVar15._8_4_ * auVar174._8_4_;
    fVar229 = auVar15._12_4_ * auVar174._12_4_;
    auVar209 = vdpps_avx(auVar174,auVar282,0x7f);
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar264._0_4_ = auVar90._0_4_ * auVar282._0_4_;
    auVar264._4_4_ = auVar90._4_4_ * auVar282._4_4_;
    auVar264._8_4_ = auVar90._8_4_ * auVar282._8_4_;
    auVar264._12_4_ = auVar90._12_4_ * auVar282._12_4_;
    auVar90 = vshufps_avx(auVar209,auVar209,0);
    auVar233._0_4_ = auVar90._0_4_ * auVar174._0_4_;
    auVar233._4_4_ = auVar90._4_4_ * auVar174._4_4_;
    auVar233._8_4_ = auVar90._8_4_ * auVar174._8_4_;
    auVar233._12_4_ = auVar90._12_4_ * auVar174._12_4_;
    auVar127 = vsubps_avx(auVar264,auVar233);
    auVar90 = vrcpss_avx(auVar160,auVar160);
    auVar90 = ZEXT416((uint)((2.0 - fVar110 * auVar90._0_4_) * auVar90._0_4_));
    auVar174 = vshufps_avx(auVar90,auVar90,0);
    auVar90 = vdpps_avx(auVar249,auVar249,0x7f);
    fVar113 = auVar90._0_4_;
    auVar282 = ZEXT416((uint)fVar113);
    auVar209 = vrsqrtss_avx(auVar282,auVar282);
    fVar179 = auVar209._0_4_;
    auVar209 = vdpps_avx(auVar249,auVar14,0x7f);
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar355._0_4_ = auVar90._0_4_ * auVar14._0_4_;
    auVar355._4_4_ = auVar90._4_4_ * auVar14._4_4_;
    auVar355._8_4_ = auVar90._8_4_ * auVar14._8_4_;
    auVar355._12_4_ = auVar90._12_4_ * auVar14._12_4_;
    lVar11 = *(long *)(_Var9 + 0x38 + lVar69);
    lVar12 = *(long *)(_Var9 + 0x48 + lVar69);
    pfVar3 = (float *)(lVar11 + lVar12 * uVar63);
    fVar71 = *pfVar3;
    fVar110 = pfVar3[1];
    fVar112 = pfVar3[2];
    fVar178 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar64);
    fVar194 = *pfVar3;
    fVar196 = pfVar3[1];
    fVar198 = pfVar3[2];
    fVar201 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
    fVar223 = *pfVar3;
    fVar225 = pfVar3[1];
    fVar228 = pfVar3[2];
    fVar230 = pfVar3[3];
    auVar90 = vshufps_avx(auVar209,auVar209,0);
    auVar79._0_4_ = auVar90._0_4_ * auVar249._0_4_;
    auVar79._4_4_ = auVar90._4_4_ * auVar249._4_4_;
    auVar79._8_4_ = auVar90._8_4_ * auVar249._8_4_;
    auVar79._12_4_ = auVar90._12_4_ * auVar249._12_4_;
    auVar14 = vsubps_avx(auVar355,auVar79);
    pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
    fVar242 = *pfVar3;
    fVar243 = pfVar3[1];
    fVar244 = pfVar3[2];
    fVar111 = pfVar3[3];
    lVar11 = *(long *)(lVar10 + 0x38 + lVar69);
    lVar10 = *(long *)(lVar10 + 0x48 + lVar69);
    auVar90 = ZEXT416((uint)(fVar179 * 1.5 - fVar113 * 0.5 * fVar179 * fVar179 * fVar179));
    auVar209 = vshufps_avx(auVar90,auVar90,0);
    fVar179 = auVar209._0_4_ * auVar249._0_4_;
    fVar195 = auVar209._4_4_ * auVar249._4_4_;
    fVar197 = auVar209._8_4_ * auVar249._8_4_;
    fVar199 = auVar209._12_4_ * auVar249._12_4_;
    auVar90 = vrcpss_avx(auVar282,auVar282);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - auVar90._0_4_ * fVar113)));
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar282 = vshufps_avx(_local_6e0,_local_6e0,0xff);
    auVar328._0_4_ = auVar282._0_4_ * fVar202;
    auVar328._4_4_ = auVar282._4_4_ * fVar224;
    auVar328._8_4_ = auVar282._8_4_ * fVar226;
    auVar328._12_4_ = auVar282._12_4_ * fVar229;
    auVar249 = vshufps_avx(auVar139,auVar139,0xff);
    auVar160 = vsubps_avx(_local_6e0,auVar328);
    auVar265._0_4_ =
         auVar249._0_4_ * fVar202 + auVar282._0_4_ * auVar15._0_4_ * auVar127._0_4_ * auVar174._0_4_
    ;
    auVar265._4_4_ =
         auVar249._4_4_ * fVar224 + auVar282._4_4_ * auVar15._4_4_ * auVar127._4_4_ * auVar174._4_4_
    ;
    auVar265._8_4_ =
         auVar249._8_4_ * fVar226 + auVar282._8_4_ * auVar15._8_4_ * auVar127._8_4_ * auVar174._8_4_
    ;
    auVar265._12_4_ =
         auVar249._12_4_ * fVar229 +
         auVar282._12_4_ * auVar15._12_4_ * auVar127._12_4_ * auVar174._12_4_;
    auVar127 = vsubps_avx(auVar139,auVar265);
    local_6e0._0_4_ = auVar328._0_4_ + (float)local_6e0._0_4_;
    local_6e0._4_4_ = auVar328._4_4_ + (float)local_6e0._4_4_;
    fStack_6d8 = auVar328._8_4_ + fStack_6d8;
    fStack_6d4 = auVar328._12_4_ + fStack_6d4;
    auVar174 = vshufps_avx(_local_5f0,_local_5f0,0xff);
    auVar151._0_4_ = auVar174._0_4_ * fVar179;
    auVar151._4_4_ = auVar174._4_4_ * fVar195;
    auVar151._8_4_ = auVar174._8_4_ * fVar197;
    auVar151._12_4_ = auVar174._12_4_ * fVar199;
    auVar282 = vshufps_avx(auVar294,auVar294,0xff);
    auVar128 = vsubps_avx(_local_5f0,auVar151);
    auVar80._0_4_ =
         auVar282._0_4_ * fVar179 + auVar174._0_4_ * auVar209._0_4_ * auVar14._0_4_ * auVar90._0_4_;
    auVar80._4_4_ =
         auVar282._4_4_ * fVar195 + auVar174._4_4_ * auVar209._4_4_ * auVar14._4_4_ * auVar90._4_4_;
    auVar80._8_4_ =
         auVar282._8_4_ * fVar197 + auVar174._8_4_ * auVar209._8_4_ * auVar14._8_4_ * auVar90._8_4_;
    auVar80._12_4_ =
         auVar282._12_4_ * fVar199 +
         auVar174._12_4_ * auVar209._12_4_ * auVar14._12_4_ * auVar90._12_4_;
    auVar258 = vsubps_avx(auVar294,auVar80);
    local_5f0._0_4_ = (float)local_5f0._0_4_ + auVar151._0_4_;
    local_5f0._4_4_ = (float)local_5f0._4_4_ + auVar151._4_4_;
    fStack_5e8 = fStack_5e8 + auVar151._8_4_;
    fStack_5e4 = fStack_5e4 + auVar151._12_4_;
    auVar81._0_4_ = fVar194 * 0.0 + fVar223 * 0.5 + fVar242 * 0.0;
    auVar81._4_4_ = fVar196 * 0.0 + fVar225 * 0.5 + fVar243 * 0.0;
    auVar81._8_4_ = fVar198 * 0.0 + fVar228 * 0.5 + fVar244 * 0.0;
    auVar81._12_4_ = fVar201 * 0.0 + fVar230 * 0.5 + fVar111 * 0.0;
    auVar119._0_4_ = fVar71 * 0.5;
    auVar119._4_4_ = fVar110 * 0.5;
    auVar119._8_4_ = fVar112 * 0.5;
    auVar119._12_4_ = fVar178 * 0.5;
    auVar72 = vsubps_avx(auVar81,auVar119);
    pfVar3 = (float *)(lVar11 + lVar1 * lVar10);
    fVar179 = *pfVar3;
    fVar195 = pfVar3[1];
    fVar197 = pfVar3[2];
    fVar199 = pfVar3[3];
    auVar90 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
    fVar203 = auVar90._0_4_;
    fVar272 = auVar90._4_4_;
    fVar227 = auVar90._8_4_;
    fVar288 = auVar90._12_4_;
    pfVar3 = (float *)(lVar11 + lVar64 * lVar10);
    fVar202 = *pfVar3;
    fVar224 = pfVar3[1];
    fVar226 = pfVar3[2];
    fVar229 = pfVar3[3];
    auVar248._0_4_ = fVar202 * 0.0 + fVar203 * 0.0 + fVar179 * 0.5;
    auVar248._4_4_ = fVar224 * 0.0 + fVar272 * 0.0 + fVar195 * 0.5;
    auVar248._8_4_ = fVar226 * 0.0 + fVar227 * 0.0 + fVar197 * 0.5;
    auVar248._12_4_ = fVar229 * 0.0 + fVar288 * 0.0 + fVar199 * 0.5;
    pfVar3 = (float *)(lVar11 + uVar63 * lVar10);
    fVar113 = *pfVar3;
    fVar114 = pfVar3[1];
    fVar200 = pfVar3[2];
    fVar245 = pfVar3[3];
    auVar283._0_4_ = fVar113 * 0.5;
    auVar283._4_4_ = fVar114 * 0.5;
    auVar283._8_4_ = fVar200 * 0.5;
    auVar283._12_4_ = fVar245 * 0.5;
    auVar209 = vsubps_avx(auVar248,auVar283);
    auVar284._0_4_ = fVar71 * -0.0 + fVar194 + fVar223 * 0.0 + fVar242 * -0.0;
    auVar284._4_4_ = fVar110 * -0.0 + fVar196 + fVar225 * 0.0 + fVar243 * -0.0;
    auVar284._8_4_ = fVar112 * -0.0 + fVar198 + fVar228 * 0.0 + fVar244 * -0.0;
    auVar284._12_4_ = fVar178 * -0.0 + fVar201 + fVar230 * 0.0 + fVar111 * -0.0;
    auVar266._0_4_ = fVar71 * -0.0 + fVar194 * 0.0 + fVar223 + fVar242 * -0.0;
    auVar266._4_4_ = fVar110 * -0.0 + fVar196 * 0.0 + fVar225 + fVar243 * -0.0;
    auVar266._8_4_ = fVar112 * -0.0 + fVar198 * 0.0 + fVar228 + fVar244 * -0.0;
    auVar266._12_4_ = fVar178 * -0.0 + fVar201 * 0.0 + fVar230 + fVar111 * -0.0;
    auVar309._0_4_ = fVar223 * 0.0 + fVar242 * 0.5;
    auVar309._4_4_ = fVar225 * 0.0 + fVar243 * 0.5;
    auVar309._8_4_ = fVar228 * 0.0 + fVar244 * 0.5;
    auVar309._12_4_ = fVar230 * 0.0 + fVar111 * 0.5;
    auVar329._0_4_ = fVar194 * 0.5;
    auVar329._4_4_ = fVar196 * 0.5;
    auVar329._8_4_ = fVar198 * 0.5;
    auVar329._12_4_ = fVar201 * 0.5;
    auVar90 = vsubps_avx(auVar309,auVar329);
    auVar320._0_4_ = fVar71 * 0.0 + auVar90._0_4_;
    auVar320._4_4_ = fVar110 * 0.0 + auVar90._4_4_;
    auVar320._8_4_ = fVar112 * 0.0 + auVar90._8_4_;
    auVar320._12_4_ = fVar178 * 0.0 + auVar90._12_4_;
    auVar310._0_4_ = fVar113 * -0.0 + fVar202 + fVar203 * -0.0 + fVar179 * 0.0;
    auVar310._4_4_ = fVar114 * -0.0 + fVar224 + fVar272 * -0.0 + fVar195 * 0.0;
    auVar310._8_4_ = fVar200 * -0.0 + fVar226 + fVar227 * -0.0 + fVar197 * 0.0;
    auVar310._12_4_ = fVar245 * -0.0 + fVar229 + fVar288 * -0.0 + fVar199 * 0.0;
    auVar120._0_4_ = fVar113 * -0.0 + fVar203 * -0.0 + fVar179 + fVar202 * 0.0;
    auVar120._4_4_ = fVar114 * -0.0 + fVar272 * -0.0 + fVar195 + fVar224 * 0.0;
    auVar120._8_4_ = fVar200 * -0.0 + fVar227 * -0.0 + fVar197 + fVar226 * 0.0;
    auVar120._12_4_ = fVar245 * -0.0 + fVar288 * -0.0 + fVar199 + fVar229 * 0.0;
    auVar152._0_4_ = fVar179 * 0.0 + fVar203 * 0.5;
    auVar152._4_4_ = fVar195 * 0.0 + fVar272 * 0.5;
    auVar152._8_4_ = fVar197 * 0.0 + fVar227 * 0.5;
    auVar152._12_4_ = fVar199 * 0.0 + fVar288 * 0.5;
    auVar184._0_4_ = fVar202 * 0.5;
    auVar184._4_4_ = fVar224 * 0.5;
    auVar184._8_4_ = fVar226 * 0.5;
    auVar184._12_4_ = fVar229 * 0.5;
    auVar90 = vsubps_avx(auVar152,auVar184);
    auVar153._0_4_ = fVar113 * 0.0 + auVar90._0_4_;
    auVar153._4_4_ = fVar114 * 0.0 + auVar90._4_4_;
    auVar153._8_4_ = fVar200 * 0.0 + auVar90._8_4_;
    auVar153._12_4_ = fVar245 * 0.0 + auVar90._12_4_;
    auVar90 = vshufps_avx(auVar310,auVar310,0xc9);
    fVar223 = auVar72._0_4_;
    auVar82._0_4_ = fVar223 * auVar90._0_4_;
    fVar225 = auVar72._4_4_;
    auVar82._4_4_ = fVar225 * auVar90._4_4_;
    fVar228 = auVar72._8_4_;
    auVar82._8_4_ = fVar228 * auVar90._8_4_;
    fVar243 = auVar72._12_4_;
    auVar82._12_4_ = fVar243 * auVar90._12_4_;
    auVar90 = vshufps_avx(auVar72,auVar72,0xc9);
    auVar311._0_4_ = auVar310._0_4_ * auVar90._0_4_;
    auVar311._4_4_ = auVar310._4_4_ * auVar90._4_4_;
    auVar311._8_4_ = auVar310._8_4_ * auVar90._8_4_;
    auVar311._12_4_ = auVar310._12_4_ * auVar90._12_4_;
    auVar174 = vsubps_avx(auVar311,auVar82);
    auVar83._0_4_ = auVar90._0_4_ * auVar209._0_4_;
    auVar83._4_4_ = auVar90._4_4_ * auVar209._4_4_;
    auVar83._8_4_ = auVar90._8_4_ * auVar209._8_4_;
    auVar83._12_4_ = auVar90._12_4_ * auVar209._12_4_;
    auVar90 = vshufps_avx(auVar209,auVar209,0xc9);
    auVar185._0_4_ = fVar223 * auVar90._0_4_;
    auVar185._4_4_ = fVar225 * auVar90._4_4_;
    auVar185._8_4_ = fVar228 * auVar90._8_4_;
    auVar185._12_4_ = fVar243 * auVar90._12_4_;
    auVar282 = vsubps_avx(auVar83,auVar185);
    auVar90 = vshufps_avx(auVar120,auVar120,0xc9);
    auVar84._0_4_ = auVar320._0_4_ * auVar90._0_4_;
    auVar84._4_4_ = auVar320._4_4_ * auVar90._4_4_;
    auVar84._8_4_ = auVar320._8_4_ * auVar90._8_4_;
    auVar84._12_4_ = auVar320._12_4_ * auVar90._12_4_;
    auVar90 = vshufps_avx(auVar320,auVar320,0xc9);
    auVar121._0_4_ = auVar90._0_4_ * auVar120._0_4_;
    auVar121._4_4_ = auVar90._4_4_ * auVar120._4_4_;
    auVar121._8_4_ = auVar90._8_4_ * auVar120._8_4_;
    auVar121._12_4_ = auVar90._12_4_ * auVar120._12_4_;
    auVar14 = vsubps_avx(auVar121,auVar84);
    auVar122._0_4_ = auVar90._0_4_ * auVar153._0_4_;
    auVar122._4_4_ = auVar90._4_4_ * auVar153._4_4_;
    auVar122._8_4_ = auVar90._8_4_ * auVar153._8_4_;
    auVar122._12_4_ = auVar90._12_4_ * auVar153._12_4_;
    auVar90 = vshufps_avx(auVar153,auVar153,0xc9);
    auVar154._0_4_ = auVar320._0_4_ * auVar90._0_4_;
    auVar154._4_4_ = auVar320._4_4_ * auVar90._4_4_;
    auVar154._8_4_ = auVar320._8_4_ * auVar90._8_4_;
    auVar154._12_4_ = auVar320._12_4_ * auVar90._12_4_;
    auVar15 = vsubps_avx(auVar122,auVar154);
    auVar174 = vshufps_avx(auVar174,auVar174,0xc9);
    auVar90 = vdpps_avx(auVar174,auVar174,0x7f);
    fVar71 = auVar90._0_4_;
    auVar249 = ZEXT416((uint)fVar71);
    auVar209 = vrsqrtss_avx(auVar249,auVar249);
    fVar110 = auVar209._0_4_;
    auVar282 = vshufps_avx(auVar282,auVar282,0xc9);
    auVar209 = vdpps_avx(auVar174,auVar282,0x7f);
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar186._0_4_ = auVar90._0_4_ * auVar282._0_4_;
    auVar186._4_4_ = auVar90._4_4_ * auVar282._4_4_;
    auVar186._8_4_ = auVar90._8_4_ * auVar282._8_4_;
    auVar186._12_4_ = auVar90._12_4_ * auVar282._12_4_;
    auVar90 = vshufps_avx(auVar209,auVar209,0);
    auVar330._0_4_ = auVar90._0_4_ * auVar174._0_4_;
    auVar330._4_4_ = auVar90._4_4_ * auVar174._4_4_;
    auVar330._8_4_ = auVar90._8_4_ * auVar174._8_4_;
    auVar330._12_4_ = auVar90._12_4_ * auVar174._12_4_;
    auVar73 = vsubps_avx(auVar186,auVar330);
    auVar90 = vrcpss_avx(auVar249,auVar249);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - fVar71 * auVar90._0_4_)));
    auVar282 = vshufps_avx(auVar90,auVar90,0);
    auVar90 = ZEXT416((uint)(fVar110 * 1.5 - fVar71 * 0.5 * fVar110 * fVar110 * fVar110));
    auVar249 = vshufps_avx(auVar90,auVar90,0);
    fVar194 = auVar174._0_4_ * auVar249._0_4_;
    fVar196 = auVar174._4_4_ * auVar249._4_4_;
    fVar198 = auVar174._8_4_ * auVar249._8_4_;
    fVar201 = auVar174._12_4_ * auVar249._12_4_;
    auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar209 = vdpps_avx(auVar14,auVar14,0x7f);
    auVar90 = vblendps_avx(auVar209,_DAT_01f7aa10,0xe);
    auVar174 = vrsqrtss_avx(auVar90,auVar90);
    fVar71 = auVar174._0_4_;
    auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar174 = vdpps_avx(auVar14,auVar15,0x7f);
    auVar139 = vshufps_avx(auVar209,auVar209,0);
    auVar312._0_4_ = auVar139._0_4_ * auVar15._0_4_;
    auVar312._4_4_ = auVar139._4_4_ * auVar15._4_4_;
    auVar312._8_4_ = auVar139._8_4_ * auVar15._8_4_;
    auVar312._12_4_ = auVar139._12_4_ * auVar15._12_4_;
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar331._0_4_ = auVar174._0_4_ * auVar14._0_4_;
    auVar331._4_4_ = auVar174._4_4_ * auVar14._4_4_;
    auVar331._8_4_ = auVar174._8_4_ * auVar14._8_4_;
    auVar331._12_4_ = auVar174._12_4_ * auVar14._12_4_;
    auVar15 = vsubps_avx(auVar312,auVar331);
    auVar90 = vrcpss_avx(auVar90,auVar90);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - auVar209._0_4_ * auVar90._0_4_)));
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar209 = ZEXT416((uint)(fVar71 * 1.5 - auVar209._0_4_ * 0.5 * fVar71 * fVar71 * fVar71));
    auVar209 = vshufps_avx(auVar209,auVar209,0);
    fVar71 = auVar14._0_4_ * auVar209._0_4_;
    fVar110 = auVar14._4_4_ * auVar209._4_4_;
    fVar112 = auVar14._8_4_ * auVar209._8_4_;
    fVar178 = auVar14._12_4_ * auVar209._12_4_;
    auVar174 = vshufps_avx(auVar72,auVar72,0xff);
    auVar14 = vshufps_avx(auVar284,auVar284,0xff);
    auVar123._0_4_ = auVar14._0_4_ * fVar194;
    auVar123._4_4_ = auVar14._4_4_ * fVar196;
    auVar123._8_4_ = auVar14._8_4_ * fVar198;
    auVar123._12_4_ = auVar14._12_4_ * fVar201;
    auVar187._0_4_ =
         auVar174._0_4_ * fVar194 + auVar249._0_4_ * auVar73._0_4_ * auVar282._0_4_ * auVar14._0_4_;
    auVar187._4_4_ =
         auVar174._4_4_ * fVar196 + auVar249._4_4_ * auVar73._4_4_ * auVar282._4_4_ * auVar14._4_4_;
    auVar187._8_4_ =
         auVar174._8_4_ * fVar198 + auVar249._8_4_ * auVar73._8_4_ * auVar282._8_4_ * auVar14._8_4_;
    auVar187._12_4_ =
         auVar174._12_4_ * fVar201 +
         auVar249._12_4_ * auVar73._12_4_ * auVar282._12_4_ * auVar14._12_4_;
    auVar249 = vsubps_avx(auVar284,auVar123);
    auVar14 = vsubps_avx(auVar72,auVar187);
    auVar174 = vshufps_avx(auVar320,auVar320,0xff);
    auVar282 = vshufps_avx(auVar266,auVar266,0xff);
    auVar295._0_4_ = auVar282._0_4_ * fVar71;
    auVar295._4_4_ = auVar282._4_4_ * fVar110;
    auVar295._8_4_ = auVar282._8_4_ * fVar112;
    auVar295._12_4_ = auVar282._12_4_ * fVar178;
    auVar155._0_4_ =
         auVar174._0_4_ * fVar71 + auVar282._0_4_ * auVar209._0_4_ * auVar15._0_4_ * auVar90._0_4_;
    auVar155._4_4_ =
         auVar174._4_4_ * fVar110 + auVar282._4_4_ * auVar209._4_4_ * auVar15._4_4_ * auVar90._4_4_;
    auVar155._8_4_ =
         auVar174._8_4_ * fVar112 + auVar282._8_4_ * auVar209._8_4_ * auVar15._8_4_ * auVar90._8_4_;
    auVar155._12_4_ =
         auVar174._12_4_ * fVar178 +
         auVar282._12_4_ * auVar209._12_4_ * auVar15._12_4_ * auVar90._12_4_;
    auVar174 = vsubps_avx(auVar266,auVar295);
    auVar343._0_4_ = auVar295._0_4_ + auVar266._0_4_;
    auVar343._4_4_ = auVar295._4_4_ + auVar266._4_4_;
    auVar343._8_4_ = auVar295._8_4_ + auVar266._8_4_;
    auVar343._12_4_ = auVar295._12_4_ + auVar266._12_4_;
    auVar282 = vsubps_avx(auVar320,auVar155);
    local_6a0 = auVar127._0_4_;
    fStack_69c = auVar127._4_4_;
    fStack_698 = auVar127._8_4_;
    fStack_694 = auVar127._12_4_;
    local_680 = auVar160._0_4_;
    fStack_67c = auVar160._4_4_;
    fStack_678 = auVar160._8_4_;
    fStack_674 = auVar160._12_4_;
    auVar90 = vshufps_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),0);
    auVar209 = vshufps_avx(ZEXT416((uint)(1.0 - fVar115)),ZEXT416((uint)(1.0 - fVar115)),0);
    fVar178 = auVar90._0_4_;
    fVar194 = auVar90._4_4_;
    fVar196 = auVar90._8_4_;
    fVar198 = auVar90._12_4_;
    fVar115 = auVar209._0_4_;
    fVar71 = auVar209._4_4_;
    fVar110 = auVar209._8_4_;
    fVar112 = auVar209._12_4_;
    local_470._0_4_ = fVar115 * local_680 + fVar178 * auVar249._0_4_;
    local_470._4_4_ = fVar71 * fStack_67c + fVar194 * auVar249._4_4_;
    fStack_468 = fVar110 * fStack_678 + fVar196 * auVar249._8_4_;
    fStack_464 = fVar112 * fStack_674 + fVar198 * auVar249._12_4_;
    fVar230 = fVar115 * (local_680 + local_6a0 * 0.33333334) +
              fVar178 * (auVar249._0_4_ + auVar14._0_4_ * 0.33333334);
    fVar244 = fVar71 * (fStack_67c + fStack_69c * 0.33333334) +
              fVar194 * (auVar249._4_4_ + auVar14._4_4_ * 0.33333334);
    fVar195 = fVar110 * (fStack_678 + fStack_698 * 0.33333334) +
              fVar196 * (auVar249._8_4_ + auVar14._8_4_ * 0.33333334);
    fVar199 = fVar112 * (fStack_674 + fStack_694 * 0.33333334) +
              fVar198 * (auVar249._12_4_ + auVar14._12_4_ * 0.33333334);
    local_6c0 = auVar258._0_4_;
    fStack_6bc = auVar258._4_4_;
    fStack_6b8 = auVar258._8_4_;
    fStack_6b4 = auVar258._12_4_;
    auVar156._0_4_ = local_6c0 * 0.33333334;
    auVar156._4_4_ = fStack_6bc * 0.33333334;
    auVar156._8_4_ = fStack_6b8 * 0.33333334;
    auVar156._12_4_ = fStack_6b4 * 0.33333334;
    auVar90 = vsubps_avx(auVar128,auVar156);
    auVar250._0_4_ = (auVar294._0_4_ + auVar80._0_4_) * 0.33333334;
    auVar250._4_4_ = (auVar294._4_4_ + auVar80._4_4_) * 0.33333334;
    auVar250._8_4_ = (auVar294._8_4_ + auVar80._8_4_) * 0.33333334;
    auVar250._12_4_ = (auVar294._12_4_ + auVar80._12_4_) * 0.33333334;
    auVar209 = vsubps_avx(_local_5f0,auVar250);
    auVar188._0_4_ = auVar282._0_4_ * 0.33333334;
    auVar188._4_4_ = auVar282._4_4_ * 0.33333334;
    auVar188._8_4_ = auVar282._8_4_ * 0.33333334;
    auVar188._12_4_ = auVar282._12_4_ * 0.33333334;
    auVar282 = vsubps_avx(auVar174,auVar188);
    auVar313._0_4_ = (auVar320._0_4_ + auVar155._0_4_) * 0.33333334;
    auVar313._4_4_ = (auVar320._4_4_ + auVar155._4_4_) * 0.33333334;
    auVar313._8_4_ = (auVar320._8_4_ + auVar155._8_4_) * 0.33333334;
    auVar313._12_4_ = (auVar320._12_4_ + auVar155._12_4_) * 0.33333334;
    auVar249 = vsubps_avx(auVar343,auVar313);
    local_480._0_4_ = fVar178 * auVar282._0_4_ + fVar115 * auVar90._0_4_;
    local_480._4_4_ = fVar194 * auVar282._4_4_ + fVar71 * auVar90._4_4_;
    fStack_478 = fVar196 * auVar282._8_4_ + fVar110 * auVar90._8_4_;
    fStack_474 = fVar198 * auVar282._12_4_ + fVar112 * auVar90._12_4_;
    fVar242 = fVar115 * auVar128._0_4_ + fVar178 * auVar174._0_4_;
    fVar111 = fVar71 * auVar128._4_4_ + fVar194 * auVar174._4_4_;
    fVar197 = fVar110 * auVar128._8_4_ + fVar196 * auVar174._8_4_;
    fVar202 = fVar112 * auVar128._12_4_ + fVar198 * auVar174._12_4_;
    local_490._0_4_ = (float)local_6e0._0_4_ * fVar115 + fVar178 * (auVar284._0_4_ + auVar123._0_4_)
    ;
    local_490._4_4_ = (float)local_6e0._4_4_ * fVar71 + fVar194 * (auVar284._4_4_ + auVar123._4_4_);
    fStack_488 = fStack_6d8 * fVar110 + fVar196 * (auVar284._8_4_ + auVar123._8_4_);
    fStack_484 = fStack_6d4 * fVar112 + fVar198 * (auVar284._12_4_ + auVar123._12_4_);
    local_4a0._0_4_ =
         fVar115 * ((float)local_6e0._0_4_ + (fVar326 + auVar265._0_4_) * 0.33333334) +
         fVar178 * (auVar284._0_4_ + auVar123._0_4_ + (fVar223 + auVar187._0_4_) * 0.33333334);
    local_4a0._4_4_ =
         fVar71 * ((float)local_6e0._4_4_ + (fVar289 + auVar265._4_4_) * 0.33333334) +
         fVar194 * (auVar284._4_4_ + auVar123._4_4_ + (fVar225 + auVar187._4_4_) * 0.33333334);
    fStack_498 = fVar110 * (fStack_6d8 + (fVar335 + auVar265._8_4_) * 0.33333334) +
                 fVar196 * (auVar284._8_4_ + auVar123._8_4_ +
                           (fVar228 + auVar187._8_4_) * 0.33333334);
    fStack_494 = fVar112 * (fStack_6d4 + (fVar290 + auVar265._12_4_) * 0.33333334) +
                 fVar198 * (auVar284._12_4_ + auVar123._12_4_ +
                           (fVar243 + auVar187._12_4_) * 0.33333334);
    local_4b0 = fVar115 * auVar209._0_4_ + fVar178 * auVar249._0_4_;
    fStack_4ac = fVar71 * auVar209._4_4_ + fVar194 * auVar249._4_4_;
    fStack_4a8 = fVar110 * auVar209._8_4_ + fVar196 * auVar249._8_4_;
    fStack_4a4 = fVar112 * auVar209._12_4_ + fVar198 * auVar249._12_4_;
    auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    local_4c0._0_4_ = (float)local_5f0._0_4_ * fVar115 + fVar178 * auVar343._0_4_;
    local_4c0._4_4_ = (float)local_5f0._4_4_ * fVar71 + fVar194 * auVar343._4_4_;
    fStack_4b8 = fStack_5e8 * fVar110 + fVar196 * auVar343._8_4_;
    fStack_4b4 = fStack_5e4 * fVar112 + fVar198 * auVar343._12_4_;
    auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    local_380 = vsubps_avx(_local_470,auVar90);
    auVar174 = vmovsldup_avx(local_380);
    auVar209 = vmovshdup_avx(local_380);
    auVar282 = vshufps_avx(local_380,local_380,0xaa);
    fVar115 = pre->ray_space[k].vx.field_0.m128[0];
    fVar71 = pre->ray_space[k].vx.field_0.m128[1];
    fVar110 = pre->ray_space[k].vx.field_0.m128[2];
    fVar112 = pre->ray_space[k].vx.field_0.m128[3];
    fVar178 = pre->ray_space[k].vy.field_0.m128[0];
    fVar194 = pre->ray_space[k].vy.field_0.m128[1];
    fVar196 = pre->ray_space[k].vy.field_0.m128[2];
    fVar198 = pre->ray_space[k].vy.field_0.m128[3];
    fVar201 = pre->ray_space[k].vz.field_0.m128[0];
    fVar223 = pre->ray_space[k].vz.field_0.m128[1];
    fVar225 = pre->ray_space[k].vz.field_0.m128[2];
    fVar228 = pre->ray_space[k].vz.field_0.m128[3];
    fVar243 = fVar115 * auVar174._0_4_ + fVar178 * auVar209._0_4_ + fVar201 * auVar282._0_4_;
    fVar179 = fVar71 * auVar174._4_4_ + fVar194 * auVar209._4_4_ + fVar223 * auVar282._4_4_;
    local_6d0._4_4_ = fVar179;
    local_6d0._0_4_ = fVar243;
    fStack_6c8 = fVar110 * auVar174._8_4_ + fVar196 * auVar209._8_4_ + fVar225 * auVar282._8_4_;
    fStack_6c4 = fVar112 * auVar174._12_4_ + fVar198 * auVar209._12_4_ + fVar228 * auVar282._12_4_;
    auVar58._4_4_ = fVar244;
    auVar58._0_4_ = fVar230;
    auVar58._8_4_ = fVar195;
    auVar58._12_4_ = fVar199;
    local_390 = vsubps_avx(auVar58,auVar90);
    auVar282 = vshufps_avx(local_390,local_390,0xaa);
    auVar209 = vmovshdup_avx(local_390);
    auVar174 = vmovsldup_avx(local_390);
    auVar124._0_4_ = fVar115 * auVar174._0_4_ + fVar178 * auVar209._0_4_ + fVar201 * auVar282._0_4_;
    auVar124._4_4_ = fVar71 * auVar174._4_4_ + fVar194 * auVar209._4_4_ + fVar223 * auVar282._4_4_;
    auVar124._8_4_ = fVar110 * auVar174._8_4_ + fVar196 * auVar209._8_4_ + fVar225 * auVar282._8_4_;
    auVar124._12_4_ =
         fVar112 * auVar174._12_4_ + fVar198 * auVar209._12_4_ + fVar228 * auVar282._12_4_;
    local_3a0 = vsubps_avx(_local_480,auVar90);
    auVar282 = vshufps_avx(local_3a0,local_3a0,0xaa);
    auVar209 = vmovshdup_avx(local_3a0);
    auVar174 = vmovsldup_avx(local_3a0);
    auVar344._0_4_ = fVar115 * auVar174._0_4_ + fVar178 * auVar209._0_4_ + fVar201 * auVar282._0_4_;
    auVar344._4_4_ = fVar71 * auVar174._4_4_ + fVar194 * auVar209._4_4_ + fVar223 * auVar282._4_4_;
    auVar344._8_4_ = fVar110 * auVar174._8_4_ + fVar196 * auVar209._8_4_ + fVar225 * auVar282._8_4_;
    auVar344._12_4_ =
         fVar112 * auVar174._12_4_ + fVar198 * auVar209._12_4_ + fVar228 * auVar282._12_4_;
    auVar56._4_4_ = fVar111;
    auVar56._0_4_ = fVar242;
    auVar56._8_4_ = fVar197;
    auVar56._12_4_ = fVar202;
    local_3b0 = vsubps_avx(auVar56,auVar90);
    auVar282 = vshufps_avx(local_3b0,local_3b0,0xaa);
    auVar209 = vmovshdup_avx(local_3b0);
    auVar174 = vmovsldup_avx(local_3b0);
    auVar267._0_4_ = auVar174._0_4_ * fVar115 + auVar209._0_4_ * fVar178 + fVar201 * auVar282._0_4_;
    auVar267._4_4_ = auVar174._4_4_ * fVar71 + auVar209._4_4_ * fVar194 + fVar223 * auVar282._4_4_;
    auVar267._8_4_ = auVar174._8_4_ * fVar110 + auVar209._8_4_ * fVar196 + fVar225 * auVar282._8_4_;
    auVar267._12_4_ =
         auVar174._12_4_ * fVar112 + auVar209._12_4_ * fVar198 + fVar228 * auVar282._12_4_;
    local_3c0 = vsubps_avx(_local_490,auVar90);
    auVar282 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar209 = vmovshdup_avx(local_3c0);
    auVar174 = vmovsldup_avx(local_3c0);
    auVar332._0_4_ = auVar174._0_4_ * fVar115 + auVar209._0_4_ * fVar178 + auVar282._0_4_ * fVar201;
    auVar332._4_4_ = auVar174._4_4_ * fVar71 + auVar209._4_4_ * fVar194 + auVar282._4_4_ * fVar223;
    auVar332._8_4_ = auVar174._8_4_ * fVar110 + auVar209._8_4_ * fVar196 + auVar282._8_4_ * fVar225;
    auVar332._12_4_ =
         auVar174._12_4_ * fVar112 + auVar209._12_4_ * fVar198 + auVar282._12_4_ * fVar228;
    local_3d0 = vsubps_avx(_local_4a0,auVar90);
    auVar282 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar209 = vmovshdup_avx(local_3d0);
    auVar174 = vmovsldup_avx(local_3d0);
    auVar296._0_4_ = auVar174._0_4_ * fVar115 + auVar209._0_4_ * fVar178 + auVar282._0_4_ * fVar201;
    auVar296._4_4_ = auVar174._4_4_ * fVar71 + auVar209._4_4_ * fVar194 + auVar282._4_4_ * fVar223;
    auVar296._8_4_ = auVar174._8_4_ * fVar110 + auVar209._8_4_ * fVar196 + auVar282._8_4_ * fVar225;
    auVar296._12_4_ =
         auVar174._12_4_ * fVar112 + auVar209._12_4_ * fVar198 + auVar282._12_4_ * fVar228;
    auVar60._4_4_ = fStack_4ac;
    auVar60._0_4_ = local_4b0;
    auVar60._8_4_ = fStack_4a8;
    auVar60._12_4_ = fStack_4a4;
    local_3e0 = vsubps_avx(auVar60,auVar90);
    auVar282 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar209 = vmovshdup_avx(local_3e0);
    auVar174 = vmovsldup_avx(local_3e0);
    auVar314._0_4_ = auVar174._0_4_ * fVar115 + auVar209._0_4_ * fVar178 + auVar282._0_4_ * fVar201;
    auVar314._4_4_ = auVar174._4_4_ * fVar71 + auVar209._4_4_ * fVar194 + auVar282._4_4_ * fVar223;
    auVar314._8_4_ = auVar174._8_4_ * fVar110 + auVar209._8_4_ * fVar196 + auVar282._8_4_ * fVar225;
    auVar314._12_4_ =
         auVar174._12_4_ * fVar112 + auVar209._12_4_ * fVar198 + auVar282._12_4_ * fVar228;
    local_3f0 = vsubps_avx(_local_4c0,auVar90);
    auVar174 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar90 = vmovshdup_avx(local_3f0);
    auVar209 = vmovsldup_avx(local_3f0);
    auVar85._0_4_ = fVar115 * auVar209._0_4_ + fVar178 * auVar90._0_4_ + fVar201 * auVar174._0_4_;
    auVar85._4_4_ = fVar71 * auVar209._4_4_ + fVar194 * auVar90._4_4_ + fVar223 * auVar174._4_4_;
    auVar85._8_4_ = fVar110 * auVar209._8_4_ + fVar196 * auVar90._8_4_ + fVar225 * auVar174._8_4_;
    auVar85._12_4_ =
         fVar112 * auVar209._12_4_ + fVar198 * auVar90._12_4_ + fVar228 * auVar174._12_4_;
    auVar282 = vmovlhps_avx(_local_6d0,auVar332);
    auVar249 = vmovlhps_avx(auVar124,auVar296);
    auVar14 = vmovlhps_avx(auVar344,auVar314);
    auVar15 = vmovlhps_avx(auVar267,auVar85);
    auVar90 = vminps_avx(auVar282,auVar249);
    auVar209 = vminps_avx(auVar14,auVar15);
    auVar174 = vminps_avx(auVar90,auVar209);
    auVar90 = vmaxps_avx(auVar282,auVar249);
    auVar209 = vmaxps_avx(auVar14,auVar15);
    auVar90 = vmaxps_avx(auVar90,auVar209);
    auVar209 = vshufpd_avx(auVar174,auVar174,3);
    auVar174 = vminps_avx(auVar174,auVar209);
    auVar209 = vshufpd_avx(auVar90,auVar90,3);
    auVar209 = vmaxps_avx(auVar90,auVar209);
    auVar251._8_4_ = 0x7fffffff;
    auVar251._0_8_ = 0x7fffffff7fffffff;
    auVar251._12_4_ = 0x7fffffff;
    auVar90 = vandps_avx(auVar174,auVar251);
    auVar209 = vandps_avx(auVar209,auVar251);
    auVar90 = vmaxps_avx(auVar90,auVar209);
    auVar209 = vmovshdup_avx(auVar90);
    auVar90 = vmaxss_avx(auVar209,auVar90);
    fVar71 = auVar90._0_4_ * 9.536743e-07;
    auVar90 = vshufps_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),0);
    local_1c0._16_16_ = auVar90;
    local_1c0._0_16_ = auVar90;
    auVar86._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
    auVar86._8_4_ = auVar90._8_4_ ^ 0x80000000;
    auVar86._12_4_ = auVar90._12_4_ ^ 0x80000000;
    local_340._16_16_ = auVar86;
    local_340._0_16_ = auVar86;
    auVar90 = vpshufd_avx(ZEXT416(uVar62),0);
    local_2e0._16_16_ = auVar90;
    local_2e0._0_16_ = auVar90;
    auVar90 = vpshufd_avx(ZEXT416(uVar7),0);
    local_300._16_16_ = auVar90;
    local_300._0_16_ = auVar90;
    uVar70 = 0;
    fVar115 = *(float *)(ray + k * 4 + 0x60);
    _local_350 = vsubps_avx(auVar249,auVar282);
    _local_360 = vsubps_avx(auVar14,auVar249);
    _local_370 = vsubps_avx(auVar15,auVar14);
    _local_410 = vsubps_avx(_local_490,_local_470);
    auVar59._4_4_ = fVar244;
    auVar59._0_4_ = fVar230;
    auVar59._8_4_ = fVar195;
    auVar59._12_4_ = fVar199;
    _local_420 = vsubps_avx(_local_4a0,auVar59);
    _local_430 = vsubps_avx(auVar60,_local_480);
    auVar57._4_4_ = fVar111;
    auVar57._0_4_ = fVar242;
    auVar57._8_4_ = fVar197;
    auVar57._12_4_ = fVar202;
    _local_440 = vsubps_avx(_local_4c0,auVar57);
    auVar353 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar357 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00fbc203:
    local_400 = auVar357._0_16_;
    auVar74 = auVar353._0_16_;
    auVar90 = vshufps_avx(auVar74,auVar74,0x50);
    auVar348._8_4_ = 0x3f800000;
    auVar348._0_8_ = 0x3f8000003f800000;
    auVar348._12_4_ = 0x3f800000;
    auVar352._16_4_ = 0x3f800000;
    auVar352._0_16_ = auVar348;
    auVar352._20_4_ = 0x3f800000;
    auVar352._24_4_ = 0x3f800000;
    auVar352._28_4_ = 0x3f800000;
    auVar209 = vsubps_avx(auVar348,auVar90);
    fVar110 = auVar90._0_4_;
    fVar112 = auVar90._4_4_;
    fVar178 = auVar90._8_4_;
    fVar194 = auVar90._12_4_;
    fVar196 = auVar209._0_4_;
    fVar198 = auVar209._4_4_;
    fVar201 = auVar209._8_4_;
    fVar223 = auVar209._12_4_;
    auVar189._0_4_ = auVar332._0_4_ * fVar110 + fVar196 * fVar243;
    auVar189._4_4_ = auVar332._4_4_ * fVar112 + fVar198 * fVar179;
    auVar189._8_4_ = auVar332._0_4_ * fVar178 + fVar201 * fVar243;
    auVar189._12_4_ = auVar332._4_4_ * fVar194 + fVar223 * fVar179;
    auVar157._0_4_ = auVar296._0_4_ * fVar110 + fVar196 * auVar124._0_4_;
    auVar157._4_4_ = auVar296._4_4_ * fVar112 + fVar198 * auVar124._4_4_;
    auVar157._8_4_ = auVar296._0_4_ * fVar178 + fVar201 * auVar124._0_4_;
    auVar157._12_4_ = auVar296._4_4_ * fVar194 + fVar223 * auVar124._4_4_;
    auVar268._0_4_ = auVar314._0_4_ * fVar110 + auVar344._0_4_ * fVar196;
    auVar268._4_4_ = auVar314._4_4_ * fVar112 + auVar344._4_4_ * fVar198;
    auVar268._8_4_ = auVar314._0_4_ * fVar178 + auVar344._0_4_ * fVar201;
    auVar268._12_4_ = auVar314._4_4_ * fVar194 + auVar344._4_4_ * fVar223;
    auVar210._0_4_ = auVar85._0_4_ * fVar110 + auVar267._0_4_ * fVar196;
    auVar210._4_4_ = auVar85._4_4_ * fVar112 + auVar267._4_4_ * fVar198;
    auVar210._8_4_ = auVar85._0_4_ * fVar178 + auVar267._0_4_ * fVar201;
    auVar210._12_4_ = auVar85._4_4_ * fVar194 + auVar267._4_4_ * fVar223;
    auVar90 = vmovshdup_avx(local_400);
    auVar209 = vshufps_avx(local_400,local_400,0);
    auVar300._16_16_ = auVar209;
    auVar300._0_16_ = auVar209;
    auVar174 = vshufps_avx(local_400,local_400,0x55);
    auVar103._16_16_ = auVar174;
    auVar103._0_16_ = auVar174;
    auVar102 = vsubps_avx(auVar103,auVar300);
    auVar174 = vshufps_avx(auVar189,auVar189,0);
    auVar139 = vshufps_avx(auVar189,auVar189,0x55);
    auVar127 = vshufps_avx(auVar157,auVar157,0);
    auVar160 = vshufps_avx(auVar157,auVar157,0x55);
    auVar128 = vshufps_avx(auVar268,auVar268,0);
    auVar258 = vshufps_avx(auVar268,auVar268,0x55);
    auVar72 = vshufps_avx(auVar210,auVar210,0);
    auVar73 = vshufps_avx(auVar210,auVar210,0x55);
    auVar90 = ZEXT416((uint)((auVar90._0_4_ - auVar357._0_4_) * 0.04761905));
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar318._0_4_ = auVar209._0_4_ + auVar102._0_4_ * 0.0;
    auVar318._4_4_ = auVar209._4_4_ + auVar102._4_4_ * 0.14285715;
    auVar318._8_4_ = auVar209._8_4_ + auVar102._8_4_ * 0.2857143;
    auVar318._12_4_ = auVar209._12_4_ + auVar102._12_4_ * 0.42857146;
    auVar318._16_4_ = auVar209._0_4_ + auVar102._16_4_ * 0.5714286;
    auVar318._20_4_ = auVar209._4_4_ + auVar102._20_4_ * 0.71428573;
    auVar318._24_4_ = auVar209._8_4_ + auVar102._24_4_ * 0.8571429;
    auVar318._28_4_ = auVar209._12_4_ + auVar102._28_4_;
    auVar16 = vsubps_avx(auVar352,auVar318);
    fVar110 = auVar127._0_4_;
    fVar178 = auVar127._4_4_;
    fVar196 = auVar127._8_4_;
    fVar201 = auVar127._12_4_;
    fVar292 = auVar16._0_4_;
    fVar302 = auVar16._4_4_;
    fVar303 = auVar16._8_4_;
    fVar304 = auVar16._12_4_;
    fVar305 = auVar16._16_4_;
    fVar306 = auVar16._20_4_;
    fVar307 = auVar16._24_4_;
    fVar288 = auVar160._0_4_;
    fVar289 = auVar160._4_4_;
    fVar290 = auVar160._8_4_;
    fVar291 = auVar160._12_4_;
    fVar346 = auVar139._12_4_ + 1.0;
    fVar245 = auVar128._0_4_;
    fVar203 = auVar128._4_4_;
    fVar272 = auVar128._8_4_;
    fVar227 = auVar128._12_4_;
    fVar225 = fVar245 * auVar318._0_4_ + fVar292 * fVar110;
    fVar228 = fVar203 * auVar318._4_4_ + fVar302 * fVar178;
    fVar224 = fVar272 * auVar318._8_4_ + fVar303 * fVar196;
    fVar226 = fVar227 * auVar318._12_4_ + fVar304 * fVar201;
    fVar229 = fVar245 * auVar318._16_4_ + fVar305 * fVar110;
    fVar113 = fVar203 * auVar318._20_4_ + fVar306 * fVar178;
    fVar114 = fVar272 * auVar318._24_4_ + fVar307 * fVar196;
    fVar112 = auVar258._0_4_;
    fVar194 = auVar258._4_4_;
    fVar198 = auVar258._8_4_;
    fVar223 = auVar258._12_4_;
    fVar326 = fVar288 * fVar292 + auVar318._0_4_ * fVar112;
    fVar335 = fVar289 * fVar302 + auVar318._4_4_ * fVar194;
    fVar336 = fVar290 * fVar303 + auVar318._8_4_ * fVar198;
    fVar337 = fVar291 * fVar304 + auVar318._12_4_ * fVar223;
    fVar338 = fVar288 * fVar305 + auVar318._16_4_ * fVar112;
    fVar339 = fVar289 * fVar306 + auVar318._20_4_ * fVar194;
    fVar340 = fVar290 * fVar307 + auVar318._24_4_ * fVar198;
    fVar341 = fVar291 + fVar201;
    auVar209 = vshufps_avx(auVar189,auVar189,0xaa);
    auVar127 = vshufps_avx(auVar189,auVar189,0xff);
    fVar200 = fVar227 + 0.0;
    auVar160 = vshufps_avx(auVar157,auVar157,0xaa);
    auVar128 = vshufps_avx(auVar157,auVar157,0xff);
    auVar221._0_4_ =
         fVar292 * (auVar318._0_4_ * fVar110 + fVar292 * auVar174._0_4_) + auVar318._0_4_ * fVar225;
    auVar221._4_4_ =
         fVar302 * (auVar318._4_4_ * fVar178 + fVar302 * auVar174._4_4_) + auVar318._4_4_ * fVar228;
    auVar221._8_4_ =
         fVar303 * (auVar318._8_4_ * fVar196 + fVar303 * auVar174._8_4_) + auVar318._8_4_ * fVar224;
    auVar221._12_4_ =
         fVar304 * (auVar318._12_4_ * fVar201 + fVar304 * auVar174._12_4_) +
         auVar318._12_4_ * fVar226;
    auVar221._16_4_ =
         fVar305 * (auVar318._16_4_ * fVar110 + fVar305 * auVar174._0_4_) +
         auVar318._16_4_ * fVar229;
    auVar221._20_4_ =
         fVar306 * (auVar318._20_4_ * fVar178 + fVar306 * auVar174._4_4_) +
         auVar318._20_4_ * fVar113;
    auVar221._24_4_ =
         fVar307 * (auVar318._24_4_ * fVar196 + fVar307 * auVar174._8_4_) +
         auVar318._24_4_ * fVar114;
    auVar221._28_4_ = auVar174._12_4_ + 1.0 + fVar223;
    auVar240._0_4_ =
         fVar292 * (fVar288 * auVar318._0_4_ + auVar139._0_4_ * fVar292) + auVar318._0_4_ * fVar326;
    auVar240._4_4_ =
         fVar302 * (fVar289 * auVar318._4_4_ + auVar139._4_4_ * fVar302) + auVar318._4_4_ * fVar335;
    auVar240._8_4_ =
         fVar303 * (fVar290 * auVar318._8_4_ + auVar139._8_4_ * fVar303) + auVar318._8_4_ * fVar336;
    auVar240._12_4_ =
         fVar304 * (fVar291 * auVar318._12_4_ + auVar139._12_4_ * fVar304) +
         auVar318._12_4_ * fVar337;
    auVar240._16_4_ =
         fVar305 * (fVar288 * auVar318._16_4_ + auVar139._0_4_ * fVar305) +
         auVar318._16_4_ * fVar338;
    auVar240._20_4_ =
         fVar306 * (fVar289 * auVar318._20_4_ + auVar139._4_4_ * fVar306) +
         auVar318._20_4_ * fVar339;
    auVar240._24_4_ =
         fVar307 * (fVar290 * auVar318._24_4_ + auVar139._8_4_ * fVar307) +
         auVar318._24_4_ * fVar340;
    auVar240._28_4_ = auVar73._12_4_ + fVar223;
    auVar104._0_4_ =
         fVar292 * fVar225 + auVar318._0_4_ * (fVar245 * fVar292 + auVar72._0_4_ * auVar318._0_4_);
    auVar104._4_4_ =
         fVar302 * fVar228 + auVar318._4_4_ * (fVar203 * fVar302 + auVar72._4_4_ * auVar318._4_4_);
    auVar104._8_4_ =
         fVar303 * fVar224 + auVar318._8_4_ * (fVar272 * fVar303 + auVar72._8_4_ * auVar318._8_4_);
    auVar104._12_4_ =
         fVar304 * fVar226 +
         auVar318._12_4_ * (fVar227 * fVar304 + auVar72._12_4_ * auVar318._12_4_);
    auVar104._16_4_ =
         fVar305 * fVar229 + auVar318._16_4_ * (fVar245 * fVar305 + auVar72._0_4_ * auVar318._16_4_)
    ;
    auVar104._20_4_ =
         fVar306 * fVar113 + auVar318._20_4_ * (fVar203 * fVar306 + auVar72._4_4_ * auVar318._20_4_)
    ;
    auVar104._24_4_ =
         fVar307 * fVar114 + auVar318._24_4_ * (fVar272 * fVar307 + auVar72._8_4_ * auVar318._24_4_)
    ;
    auVar104._28_4_ = fVar201 + 1.0 + fVar200;
    auVar325._0_4_ =
         fVar292 * fVar326 + auVar318._0_4_ * (auVar73._0_4_ * auVar318._0_4_ + fVar292 * fVar112);
    auVar325._4_4_ =
         fVar302 * fVar335 + auVar318._4_4_ * (auVar73._4_4_ * auVar318._4_4_ + fVar302 * fVar194);
    auVar325._8_4_ =
         fVar303 * fVar336 + auVar318._8_4_ * (auVar73._8_4_ * auVar318._8_4_ + fVar303 * fVar198);
    auVar325._12_4_ =
         fVar304 * fVar337 +
         auVar318._12_4_ * (auVar73._12_4_ * auVar318._12_4_ + fVar304 * fVar223);
    auVar325._16_4_ =
         fVar305 * fVar338 + auVar318._16_4_ * (auVar73._0_4_ * auVar318._16_4_ + fVar305 * fVar112)
    ;
    auVar325._20_4_ =
         fVar306 * fVar339 + auVar318._20_4_ * (auVar73._4_4_ * auVar318._20_4_ + fVar306 * fVar194)
    ;
    auVar325._24_4_ =
         fVar307 * fVar340 + auVar318._24_4_ * (auVar73._8_4_ * auVar318._24_4_ + fVar307 * fVar198)
    ;
    auVar325._28_4_ = fVar200 + fVar223 + 0.0;
    local_200._0_4_ = fVar292 * auVar221._0_4_ + auVar318._0_4_ * auVar104._0_4_;
    local_200._4_4_ = fVar302 * auVar221._4_4_ + auVar318._4_4_ * auVar104._4_4_;
    local_200._8_4_ = fVar303 * auVar221._8_4_ + auVar318._8_4_ * auVar104._8_4_;
    local_200._12_4_ = fVar304 * auVar221._12_4_ + auVar318._12_4_ * auVar104._12_4_;
    local_200._16_4_ = fVar305 * auVar221._16_4_ + auVar318._16_4_ * auVar104._16_4_;
    local_200._20_4_ = fVar306 * auVar221._20_4_ + auVar318._20_4_ * auVar104._20_4_;
    local_200._24_4_ = fVar307 * auVar221._24_4_ + auVar318._24_4_ * auVar104._24_4_;
    local_200._28_4_ = fVar341 + fVar223 + 0.0;
    auVar193._0_4_ = fVar292 * auVar240._0_4_ + auVar318._0_4_ * auVar325._0_4_;
    auVar193._4_4_ = fVar302 * auVar240._4_4_ + auVar318._4_4_ * auVar325._4_4_;
    auVar193._8_4_ = fVar303 * auVar240._8_4_ + auVar318._8_4_ * auVar325._8_4_;
    auVar193._12_4_ = fVar304 * auVar240._12_4_ + auVar318._12_4_ * auVar325._12_4_;
    auVar193._16_4_ = fVar305 * auVar240._16_4_ + auVar318._16_4_ * auVar325._16_4_;
    auVar193._20_4_ = fVar306 * auVar240._20_4_ + auVar318._20_4_ * auVar325._20_4_;
    auVar193._24_4_ = fVar307 * auVar240._24_4_ + auVar318._24_4_ * auVar325._24_4_;
    auVar193._28_4_ = fVar341 + fVar200;
    auVar17 = vsubps_avx(auVar104,auVar221);
    auVar102 = vsubps_avx(auVar325,auVar240);
    local_5e0 = auVar90._0_4_;
    fStack_5dc = auVar90._4_4_;
    fStack_5d8 = auVar90._8_4_;
    fStack_5d4 = auVar90._12_4_;
    local_240 = local_5e0 * auVar17._0_4_ * 3.0;
    fStack_23c = fStack_5dc * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_23c;
    auVar18._0_4_ = local_240;
    fStack_238 = fStack_5d8 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_238;
    fStack_234 = fStack_5d4 * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_234;
    fStack_230 = local_5e0 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_230;
    fStack_22c = fStack_5dc * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_22c;
    fStack_228 = fStack_5d8 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_228;
    auVar18._28_4_ = auVar17._28_4_;
    local_260 = local_5e0 * auVar102._0_4_ * 3.0;
    fStack_25c = fStack_5dc * auVar102._4_4_ * 3.0;
    auVar19._4_4_ = fStack_25c;
    auVar19._0_4_ = local_260;
    fStack_258 = fStack_5d8 * auVar102._8_4_ * 3.0;
    auVar19._8_4_ = fStack_258;
    fStack_254 = fStack_5d4 * auVar102._12_4_ * 3.0;
    auVar19._12_4_ = fStack_254;
    fStack_250 = local_5e0 * auVar102._16_4_ * 3.0;
    auVar19._16_4_ = fStack_250;
    fStack_24c = fStack_5dc * auVar102._20_4_ * 3.0;
    auVar19._20_4_ = fStack_24c;
    fStack_248 = fStack_5d8 * auVar102._24_4_ * 3.0;
    auVar19._24_4_ = fStack_248;
    auVar19._28_4_ = fVar341;
    auVar18 = vsubps_avx(local_200,auVar18);
    auVar102 = vperm2f128_avx(auVar18,auVar18,1);
    auVar102 = vshufps_avx(auVar102,auVar18,0x30);
    auVar102 = vshufps_avx(auVar18,auVar102,0x29);
    auVar19 = vsubps_avx(auVar193,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar18,0x29);
    fVar339 = auVar160._0_4_;
    fVar340 = auVar160._4_4_;
    fVar358 = auVar160._8_4_;
    fVar201 = auVar209._12_4_;
    fVar203 = auVar128._0_4_;
    fVar227 = auVar128._4_4_;
    fVar326 = auVar128._8_4_;
    fVar335 = auVar128._12_4_;
    auVar90 = vshufps_avx(auVar268,auVar268,0xaa);
    fVar110 = auVar90._0_4_;
    fVar178 = auVar90._4_4_;
    fVar196 = auVar90._8_4_;
    fVar223 = auVar90._12_4_;
    fVar224 = auVar318._0_4_ * fVar110 + fVar339 * fVar292;
    fVar226 = auVar318._4_4_ * fVar178 + fVar340 * fVar302;
    fVar229 = auVar318._8_4_ * fVar196 + fVar358 * fVar303;
    fVar113 = auVar318._12_4_ * fVar223 + auVar160._12_4_ * fVar304;
    fVar114 = auVar318._16_4_ * fVar110 + fVar339 * fVar305;
    fVar200 = auVar318._20_4_ * fVar178 + fVar340 * fVar306;
    fVar245 = auVar318._24_4_ * fVar196 + fVar358 * fVar307;
    auVar90 = vshufps_avx(auVar268,auVar268,0xff);
    fVar112 = auVar90._0_4_;
    fVar194 = auVar90._4_4_;
    fVar198 = auVar90._8_4_;
    fVar225 = auVar90._12_4_;
    fVar272 = auVar318._0_4_ * fVar112 + fVar203 * fVar292;
    fVar288 = auVar318._4_4_ * fVar194 + fVar227 * fVar302;
    fVar289 = auVar318._8_4_ * fVar198 + fVar326 * fVar303;
    fVar290 = auVar318._12_4_ * fVar225 + fVar335 * fVar304;
    fVar336 = auVar318._16_4_ * fVar112 + fVar203 * fVar305;
    fVar291 = auVar318._20_4_ * fVar194 + fVar227 * fVar306;
    fVar337 = auVar318._24_4_ * fVar198 + fVar326 * fVar307;
    auVar90 = vshufps_avx(auVar210,auVar210,0xaa);
    fVar338 = auVar90._12_4_ + fVar223;
    auVar174 = vshufps_avx(auVar210,auVar210,0xff);
    fVar228 = auVar174._12_4_;
    auVar105._0_4_ =
         fVar292 * (fVar339 * auVar318._0_4_ + fVar292 * auVar209._0_4_) + auVar318._0_4_ * fVar224;
    auVar105._4_4_ =
         fVar302 * (fVar340 * auVar318._4_4_ + fVar302 * auVar209._4_4_) + auVar318._4_4_ * fVar226;
    auVar105._8_4_ =
         fVar303 * (fVar358 * auVar318._8_4_ + fVar303 * auVar209._8_4_) + auVar318._8_4_ * fVar229;
    auVar105._12_4_ =
         fVar304 * (auVar160._12_4_ * auVar318._12_4_ + fVar304 * fVar201) +
         auVar318._12_4_ * fVar113;
    auVar105._16_4_ =
         fVar305 * (fVar339 * auVar318._16_4_ + fVar305 * auVar209._0_4_) +
         auVar318._16_4_ * fVar114;
    auVar105._20_4_ =
         fVar306 * (fVar340 * auVar318._20_4_ + fVar306 * auVar209._4_4_) +
         auVar318._20_4_ * fVar200;
    auVar105._24_4_ =
         fVar307 * (fVar358 * auVar318._24_4_ + fVar307 * auVar209._8_4_) +
         auVar318._24_4_ * fVar245;
    auVar105._28_4_ = auVar19._28_4_ + fVar201 + fVar228;
    auVar143._0_4_ =
         fVar292 * (fVar203 * auVar318._0_4_ + auVar127._0_4_ * fVar292) + auVar318._0_4_ * fVar272;
    auVar143._4_4_ =
         fVar302 * (fVar227 * auVar318._4_4_ + auVar127._4_4_ * fVar302) + auVar318._4_4_ * fVar288;
    auVar143._8_4_ =
         fVar303 * (fVar326 * auVar318._8_4_ + auVar127._8_4_ * fVar303) + auVar318._8_4_ * fVar289;
    auVar143._12_4_ =
         fVar304 * (fVar335 * auVar318._12_4_ + auVar127._12_4_ * fVar304) +
         auVar318._12_4_ * fVar290;
    auVar143._16_4_ =
         fVar305 * (fVar203 * auVar318._16_4_ + auVar127._0_4_ * fVar305) +
         auVar318._16_4_ * fVar336;
    auVar143._20_4_ =
         fVar306 * (fVar227 * auVar318._20_4_ + auVar127._4_4_ * fVar306) +
         auVar318._20_4_ * fVar291;
    auVar143._24_4_ =
         fVar307 * (fVar326 * auVar318._24_4_ + auVar127._8_4_ * fVar307) +
         auVar318._24_4_ * fVar337;
    auVar143._28_4_ = fVar201 + auVar18._28_4_ + fVar228;
    auVar18 = vperm2f128_avx(local_200,local_200,1);
    auVar18 = vshufps_avx(auVar18,local_200,0x30);
    auVar103 = vshufps_avx(local_200,auVar18,0x29);
    auVar241._0_4_ =
         auVar318._0_4_ * (auVar90._0_4_ * auVar318._0_4_ + fVar292 * fVar110) + fVar292 * fVar224;
    auVar241._4_4_ =
         auVar318._4_4_ * (auVar90._4_4_ * auVar318._4_4_ + fVar302 * fVar178) + fVar302 * fVar226;
    auVar241._8_4_ =
         auVar318._8_4_ * (auVar90._8_4_ * auVar318._8_4_ + fVar303 * fVar196) + fVar303 * fVar229;
    auVar241._12_4_ =
         auVar318._12_4_ * (auVar90._12_4_ * auVar318._12_4_ + fVar304 * fVar223) +
         fVar304 * fVar113;
    auVar241._16_4_ =
         auVar318._16_4_ * (auVar90._0_4_ * auVar318._16_4_ + fVar305 * fVar110) + fVar305 * fVar114
    ;
    auVar241._20_4_ =
         auVar318._20_4_ * (auVar90._4_4_ * auVar318._20_4_ + fVar306 * fVar178) + fVar306 * fVar200
    ;
    auVar241._24_4_ =
         auVar318._24_4_ * (auVar90._8_4_ * auVar318._24_4_ + fVar307 * fVar196) + fVar307 * fVar245
    ;
    auVar241._28_4_ = fVar338 + fVar346 + auVar240._28_4_;
    auVar287._0_4_ =
         fVar292 * fVar272 + auVar318._0_4_ * (auVar318._0_4_ * auVar174._0_4_ + fVar292 * fVar112);
    auVar287._4_4_ =
         fVar302 * fVar288 + auVar318._4_4_ * (auVar318._4_4_ * auVar174._4_4_ + fVar302 * fVar194);
    auVar287._8_4_ =
         fVar303 * fVar289 + auVar318._8_4_ * (auVar318._8_4_ * auVar174._8_4_ + fVar303 * fVar198);
    auVar287._12_4_ =
         fVar304 * fVar290 + auVar318._12_4_ * (auVar318._12_4_ * fVar228 + fVar304 * fVar225);
    auVar287._16_4_ =
         fVar305 * fVar336 +
         auVar318._16_4_ * (auVar318._16_4_ * auVar174._0_4_ + fVar305 * fVar112);
    auVar287._20_4_ =
         fVar306 * fVar291 +
         auVar318._20_4_ * (auVar318._20_4_ * auVar174._4_4_ + fVar306 * fVar194);
    auVar287._24_4_ =
         fVar307 * fVar337 +
         auVar318._24_4_ * (auVar318._24_4_ * auVar174._8_4_ + fVar307 * fVar198);
    auVar287._28_4_ = fVar346 + fVar335 + fVar228 + fVar225;
    auVar271._0_4_ = fVar292 * auVar105._0_4_ + auVar318._0_4_ * auVar241._0_4_;
    auVar271._4_4_ = fVar302 * auVar105._4_4_ + auVar318._4_4_ * auVar241._4_4_;
    auVar271._8_4_ = fVar303 * auVar105._8_4_ + auVar318._8_4_ * auVar241._8_4_;
    auVar271._12_4_ = fVar304 * auVar105._12_4_ + auVar318._12_4_ * auVar241._12_4_;
    auVar271._16_4_ = fVar305 * auVar105._16_4_ + auVar318._16_4_ * auVar241._16_4_;
    auVar271._20_4_ = fVar306 * auVar105._20_4_ + auVar318._20_4_ * auVar241._20_4_;
    auVar271._24_4_ = fVar307 * auVar105._24_4_ + auVar318._24_4_ * auVar241._24_4_;
    auVar271._28_4_ = fVar338 + fVar228 + fVar225;
    auVar301._0_4_ = fVar292 * auVar143._0_4_ + auVar318._0_4_ * auVar287._0_4_;
    auVar301._4_4_ = fVar302 * auVar143._4_4_ + auVar318._4_4_ * auVar287._4_4_;
    auVar301._8_4_ = fVar303 * auVar143._8_4_ + auVar318._8_4_ * auVar287._8_4_;
    auVar301._12_4_ = fVar304 * auVar143._12_4_ + auVar318._12_4_ * auVar287._12_4_;
    auVar301._16_4_ = fVar305 * auVar143._16_4_ + auVar318._16_4_ * auVar287._16_4_;
    auVar301._20_4_ = fVar306 * auVar143._20_4_ + auVar318._20_4_ * auVar287._20_4_;
    auVar301._24_4_ = fVar307 * auVar143._24_4_ + auVar318._24_4_ * auVar287._24_4_;
    auVar301._28_4_ = auVar16._28_4_ + auVar318._28_4_;
    auVar20 = vsubps_avx(auVar241,auVar105);
    auVar18 = vsubps_avx(auVar287,auVar143);
    local_280 = local_5e0 * auVar20._0_4_ * 3.0;
    fStack_27c = fStack_5dc * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_27c;
    auVar16._0_4_ = local_280;
    fStack_278 = fStack_5d8 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_278;
    fStack_274 = fStack_5d4 * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_274;
    fStack_270 = local_5e0 * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_270;
    fStack_26c = fStack_5dc * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_26c;
    fStack_268 = fStack_5d8 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_268;
    auVar16._28_4_ = auVar20._28_4_;
    local_2a0 = local_5e0 * auVar18._0_4_ * 3.0;
    fStack_29c = fStack_5dc * auVar18._4_4_ * 3.0;
    auVar21._4_4_ = fStack_29c;
    auVar21._0_4_ = local_2a0;
    fStack_298 = fStack_5d8 * auVar18._8_4_ * 3.0;
    auVar21._8_4_ = fStack_298;
    fStack_294 = fStack_5d4 * auVar18._12_4_ * 3.0;
    auVar21._12_4_ = fStack_294;
    fStack_290 = local_5e0 * auVar18._16_4_ * 3.0;
    auVar21._16_4_ = fStack_290;
    fStack_28c = fStack_5dc * auVar18._20_4_ * 3.0;
    auVar21._20_4_ = fStack_28c;
    fStack_288 = fStack_5d8 * auVar18._24_4_ * 3.0;
    auVar21._24_4_ = fStack_288;
    auVar21._28_4_ = auVar241._28_4_;
    auVar18 = vperm2f128_avx(auVar271,auVar271,1);
    auVar18 = vshufps_avx(auVar18,auVar271,0x30);
    auVar104 = vshufps_avx(auVar271,auVar18,0x29);
    auVar16 = vsubps_avx(auVar271,auVar16);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar18 = vshufps_avx(auVar16,auVar18,0x29);
    auVar21 = vsubps_avx(auVar301,auVar21);
    auVar16 = vperm2f128_avx(auVar21,auVar21,1);
    auVar16 = vshufps_avx(auVar16,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar16,0x29);
    auVar22 = vsubps_avx(auVar271,local_200);
    auVar105 = vsubps_avx(auVar104,auVar103);
    fVar110 = auVar105._0_4_ + auVar22._0_4_;
    fVar112 = auVar105._4_4_ + auVar22._4_4_;
    fVar178 = auVar105._8_4_ + auVar22._8_4_;
    fVar194 = auVar105._12_4_ + auVar22._12_4_;
    fVar196 = auVar105._16_4_ + auVar22._16_4_;
    fVar198 = auVar105._20_4_ + auVar22._20_4_;
    fVar201 = auVar105._24_4_ + auVar22._24_4_;
    auVar16 = vperm2f128_avx(auVar193,auVar193,1);
    auVar16 = vshufps_avx(auVar16,auVar193,0x30);
    local_220 = vshufps_avx(auVar193,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar301,auVar301,1);
    auVar16 = vshufps_avx(auVar16,auVar301,0x30);
    local_1e0 = vshufps_avx(auVar301,auVar16,0x29);
    auVar16 = vsubps_avx(auVar301,auVar193);
    auVar143 = vsubps_avx(local_1e0,local_220);
    fVar223 = auVar143._0_4_ + auVar16._0_4_;
    fVar225 = auVar143._4_4_ + auVar16._4_4_;
    fVar228 = auVar143._8_4_ + auVar16._8_4_;
    fVar224 = auVar143._12_4_ + auVar16._12_4_;
    fVar226 = auVar143._16_4_ + auVar16._16_4_;
    fVar229 = auVar143._20_4_ + auVar16._20_4_;
    fVar113 = auVar143._24_4_ + auVar16._24_4_;
    auVar23._4_4_ = fVar112 * auVar193._4_4_;
    auVar23._0_4_ = fVar110 * auVar193._0_4_;
    auVar23._8_4_ = fVar178 * auVar193._8_4_;
    auVar23._12_4_ = fVar194 * auVar193._12_4_;
    auVar23._16_4_ = fVar196 * auVar193._16_4_;
    auVar23._20_4_ = fVar198 * auVar193._20_4_;
    auVar23._24_4_ = fVar201 * auVar193._24_4_;
    auVar23._28_4_ = auVar16._28_4_;
    auVar24._4_4_ = fVar225 * local_200._4_4_;
    auVar24._0_4_ = fVar223 * local_200._0_4_;
    auVar24._8_4_ = fVar228 * local_200._8_4_;
    auVar24._12_4_ = fVar224 * local_200._12_4_;
    auVar24._16_4_ = fVar226 * local_200._16_4_;
    auVar24._20_4_ = fVar229 * local_200._20_4_;
    auVar24._24_4_ = fVar113 * local_200._24_4_;
    auVar24._28_4_ = fVar338;
    auVar23 = vsubps_avx(auVar23,auVar24);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar17._28_4_;
    local_260 = local_260 + auVar193._0_4_;
    fStack_25c = fStack_25c + auVar193._4_4_;
    fStack_258 = fStack_258 + auVar193._8_4_;
    fStack_254 = fStack_254 + auVar193._12_4_;
    fStack_250 = fStack_250 + auVar193._16_4_;
    fStack_24c = fStack_24c + auVar193._20_4_;
    fStack_248 = fStack_248 + auVar193._24_4_;
    fStack_244 = fVar341 + auVar193._28_4_;
    auVar17._4_4_ = fVar112 * fStack_25c;
    auVar17._0_4_ = fVar110 * local_260;
    auVar17._8_4_ = fVar178 * fStack_258;
    auVar17._12_4_ = fVar194 * fStack_254;
    auVar17._16_4_ = fVar196 * fStack_250;
    auVar17._20_4_ = fVar198 * fStack_24c;
    auVar17._24_4_ = fVar201 * fStack_248;
    auVar17._28_4_ = fVar341;
    auVar25._4_4_ = fVar225 * fStack_23c;
    auVar25._0_4_ = fVar223 * local_240;
    auVar25._8_4_ = fVar228 * fStack_238;
    auVar25._12_4_ = fVar224 * fStack_234;
    auVar25._16_4_ = fVar226 * fStack_230;
    auVar25._20_4_ = fVar229 * fStack_22c;
    auVar25._24_4_ = fVar113 * fStack_228;
    auVar25._28_4_ = fVar341 + auVar193._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar25);
    local_680 = auVar19._0_4_;
    fStack_67c = auVar19._4_4_;
    fStack_678 = auVar19._8_4_;
    fStack_674 = auVar19._12_4_;
    fStack_670 = auVar19._16_4_;
    fStack_66c = auVar19._20_4_;
    fStack_668 = auVar19._24_4_;
    auVar26._4_4_ = fVar112 * fStack_67c;
    auVar26._0_4_ = fVar110 * local_680;
    auVar26._8_4_ = fVar178 * fStack_678;
    auVar26._12_4_ = fVar194 * fStack_674;
    auVar26._16_4_ = fVar196 * fStack_670;
    auVar26._20_4_ = fVar198 * fStack_66c;
    auVar26._24_4_ = fVar201 * fStack_668;
    auVar26._28_4_ = fVar341;
    local_6c0 = auVar102._0_4_;
    fStack_6bc = auVar102._4_4_;
    fStack_6b8 = auVar102._8_4_;
    fStack_6b4 = auVar102._12_4_;
    fStack_6b0 = auVar102._16_4_;
    fStack_6ac = auVar102._20_4_;
    fStack_6a8 = auVar102._24_4_;
    auVar27._4_4_ = fVar225 * fStack_6bc;
    auVar27._0_4_ = fVar223 * local_6c0;
    auVar27._8_4_ = fVar228 * fStack_6b8;
    auVar27._12_4_ = fVar224 * fStack_6b4;
    auVar27._16_4_ = fVar226 * fStack_6b0;
    auVar27._20_4_ = fVar229 * fStack_6ac;
    auVar27._24_4_ = fVar113 * fStack_6a8;
    auVar27._28_4_ = local_200._28_4_;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_220._4_4_ * fVar112;
    auVar28._0_4_ = local_220._0_4_ * fVar110;
    auVar28._8_4_ = local_220._8_4_ * fVar178;
    auVar28._12_4_ = local_220._12_4_ * fVar194;
    auVar28._16_4_ = local_220._16_4_ * fVar196;
    auVar28._20_4_ = local_220._20_4_ * fVar198;
    auVar28._24_4_ = local_220._24_4_ * fVar201;
    auVar28._28_4_ = fVar341;
    auVar29._4_4_ = auVar103._4_4_ * fVar225;
    auVar29._0_4_ = auVar103._0_4_ * fVar223;
    auVar29._8_4_ = auVar103._8_4_ * fVar228;
    auVar29._12_4_ = auVar103._12_4_ * fVar224;
    auVar29._16_4_ = auVar103._16_4_ * fVar226;
    auVar29._20_4_ = auVar103._20_4_ * fVar229;
    auVar29._24_4_ = auVar103._24_4_ * fVar113;
    auVar29._28_4_ = local_220._28_4_;
    local_5e0 = auVar18._0_4_;
    fStack_5dc = auVar18._4_4_;
    fStack_5d8 = auVar18._8_4_;
    fStack_5d4 = auVar18._12_4_;
    fStack_5d0 = auVar18._16_4_;
    fStack_5cc = auVar18._20_4_;
    fStack_5c8 = auVar18._24_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar301._4_4_ * fVar112;
    auVar30._0_4_ = auVar301._0_4_ * fVar110;
    auVar30._8_4_ = auVar301._8_4_ * fVar178;
    auVar30._12_4_ = auVar301._12_4_ * fVar194;
    auVar30._16_4_ = auVar301._16_4_ * fVar196;
    auVar30._20_4_ = auVar301._20_4_ * fVar198;
    auVar30._24_4_ = auVar301._24_4_ * fVar201;
    auVar30._28_4_ = fVar341;
    auVar31._4_4_ = fVar225 * auVar271._4_4_;
    auVar31._0_4_ = fVar223 * auVar271._0_4_;
    auVar31._8_4_ = fVar228 * auVar271._8_4_;
    auVar31._12_4_ = fVar224 * auVar271._12_4_;
    auVar31._16_4_ = fVar226 * auVar271._16_4_;
    auVar31._20_4_ = fVar229 * auVar271._20_4_;
    auVar31._24_4_ = fVar113 * auVar271._24_4_;
    auVar31._28_4_ = fStack_224;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_280 = auVar271._0_4_ + local_280;
    fStack_27c = auVar271._4_4_ + fStack_27c;
    fStack_278 = auVar271._8_4_ + fStack_278;
    fStack_274 = auVar271._12_4_ + fStack_274;
    fStack_270 = auVar271._16_4_ + fStack_270;
    fStack_26c = auVar271._20_4_ + fStack_26c;
    fStack_268 = auVar271._24_4_ + fStack_268;
    fStack_264 = auVar271._28_4_ + auVar20._28_4_;
    local_2a0 = auVar301._0_4_ + local_2a0;
    fStack_29c = auVar301._4_4_ + fStack_29c;
    fStack_298 = auVar301._8_4_ + fStack_298;
    fStack_294 = auVar301._12_4_ + fStack_294;
    fStack_290 = auVar301._16_4_ + fStack_290;
    fStack_28c = auVar301._20_4_ + fStack_28c;
    fStack_288 = auVar301._24_4_ + fStack_288;
    fStack_284 = auVar301._28_4_ + auVar241._28_4_;
    auVar20._4_4_ = fVar112 * fStack_29c;
    auVar20._0_4_ = fVar110 * local_2a0;
    auVar20._8_4_ = fVar178 * fStack_298;
    auVar20._12_4_ = fVar194 * fStack_294;
    auVar20._16_4_ = fVar196 * fStack_290;
    auVar20._20_4_ = fVar198 * fStack_28c;
    auVar20._24_4_ = fVar201 * fStack_288;
    auVar20._28_4_ = auVar301._28_4_ + auVar241._28_4_;
    auVar32._4_4_ = fStack_27c * fVar225;
    auVar32._0_4_ = local_280 * fVar223;
    auVar32._8_4_ = fStack_278 * fVar228;
    auVar32._12_4_ = fStack_274 * fVar224;
    auVar32._16_4_ = fStack_270 * fVar226;
    auVar32._20_4_ = fStack_26c * fVar229;
    auVar32._24_4_ = fStack_268 * fVar113;
    auVar32._28_4_ = fStack_264;
    auVar20 = vsubps_avx(auVar20,auVar32);
    auVar33._4_4_ = fVar112 * auVar21._4_4_;
    auVar33._0_4_ = fVar110 * auVar21._0_4_;
    auVar33._8_4_ = fVar178 * auVar21._8_4_;
    auVar33._12_4_ = fVar194 * auVar21._12_4_;
    auVar33._16_4_ = fVar196 * auVar21._16_4_;
    auVar33._20_4_ = fVar198 * auVar21._20_4_;
    auVar33._24_4_ = fVar201 * auVar21._24_4_;
    auVar33._28_4_ = fStack_264;
    auVar34._4_4_ = fVar225 * fStack_5dc;
    auVar34._0_4_ = fVar223 * local_5e0;
    auVar34._8_4_ = fVar228 * fStack_5d8;
    auVar34._12_4_ = fVar224 * fStack_5d4;
    auVar34._16_4_ = fVar226 * fStack_5d0;
    auVar34._20_4_ = fVar229 * fStack_5cc;
    auVar34._24_4_ = fVar113 * fStack_5c8;
    auVar34._28_4_ = auVar21._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar112 * local_1e0._4_4_;
    auVar35._0_4_ = fVar110 * local_1e0._0_4_;
    auVar35._8_4_ = fVar178 * local_1e0._8_4_;
    auVar35._12_4_ = fVar194 * local_1e0._12_4_;
    auVar35._16_4_ = fVar196 * local_1e0._16_4_;
    auVar35._20_4_ = fVar198 * local_1e0._20_4_;
    auVar35._24_4_ = fVar201 * local_1e0._24_4_;
    auVar35._28_4_ = auVar105._28_4_ + auVar22._28_4_;
    auVar22._4_4_ = auVar104._4_4_ * fVar225;
    auVar22._0_4_ = auVar104._0_4_ * fVar223;
    auVar22._8_4_ = auVar104._8_4_ * fVar228;
    auVar22._12_4_ = auVar104._12_4_ * fVar224;
    auVar22._16_4_ = auVar104._16_4_ * fVar226;
    auVar22._20_4_ = auVar104._20_4_ * fVar229;
    auVar22._24_4_ = auVar104._24_4_ * fVar113;
    auVar22._28_4_ = auVar143._28_4_ + auVar16._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar18 = vminps_avx(auVar23,auVar17);
    auVar102 = vmaxps_avx(auVar23,auVar17);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar24,auVar25);
    auVar102 = vmaxps_avx(auVar102,auVar18);
    auVar16 = vminps_avx(auVar26,auVar20);
    auVar18 = vmaxps_avx(auVar26,auVar20);
    auVar17 = vminps_avx(auVar27,auVar22);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar19,auVar17);
    auVar19 = vmaxps_avx(auVar27,auVar22);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar102,auVar18);
    auVar102 = vcmpps_avx(auVar17,local_1c0,2);
    auVar18 = vcmpps_avx(auVar18,local_340,5);
    auVar102 = vandps_avx(auVar18,auVar102);
    auVar18 = local_2c0 & auVar102;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar103,local_200);
      auVar19 = vsubps_avx(auVar104,auVar271);
      fVar112 = auVar18._0_4_ + auVar19._0_4_;
      fVar178 = auVar18._4_4_ + auVar19._4_4_;
      fVar194 = auVar18._8_4_ + auVar19._8_4_;
      fVar196 = auVar18._12_4_ + auVar19._12_4_;
      fVar198 = auVar18._16_4_ + auVar19._16_4_;
      fVar201 = auVar18._20_4_ + auVar19._20_4_;
      fVar223 = auVar18._24_4_ + auVar19._24_4_;
      auVar17 = vsubps_avx(local_220,auVar193);
      auVar20 = vsubps_avx(local_1e0,auVar301);
      fVar225 = auVar17._0_4_ + auVar20._0_4_;
      fVar228 = auVar17._4_4_ + auVar20._4_4_;
      fVar224 = auVar17._8_4_ + auVar20._8_4_;
      fVar226 = auVar17._12_4_ + auVar20._12_4_;
      fVar229 = auVar17._16_4_ + auVar20._16_4_;
      fVar113 = auVar17._20_4_ + auVar20._20_4_;
      fVar114 = auVar17._24_4_ + auVar20._24_4_;
      fVar110 = auVar20._28_4_;
      auVar36._4_4_ = auVar193._4_4_ * fVar178;
      auVar36._0_4_ = auVar193._0_4_ * fVar112;
      auVar36._8_4_ = auVar193._8_4_ * fVar194;
      auVar36._12_4_ = auVar193._12_4_ * fVar196;
      auVar36._16_4_ = auVar193._16_4_ * fVar198;
      auVar36._20_4_ = auVar193._20_4_ * fVar201;
      auVar36._24_4_ = auVar193._24_4_ * fVar223;
      auVar36._28_4_ = auVar193._28_4_;
      auVar37._4_4_ = local_200._4_4_ * fVar228;
      auVar37._0_4_ = local_200._0_4_ * fVar225;
      auVar37._8_4_ = local_200._8_4_ * fVar224;
      auVar37._12_4_ = local_200._12_4_ * fVar226;
      auVar37._16_4_ = local_200._16_4_ * fVar229;
      auVar37._20_4_ = local_200._20_4_ * fVar113;
      auVar37._24_4_ = local_200._24_4_ * fVar114;
      auVar37._28_4_ = local_200._28_4_;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar178 * fStack_25c;
      auVar38._0_4_ = fVar112 * local_260;
      auVar38._8_4_ = fVar194 * fStack_258;
      auVar38._12_4_ = fVar196 * fStack_254;
      auVar38._16_4_ = fVar198 * fStack_250;
      auVar38._20_4_ = fVar201 * fStack_24c;
      auVar38._24_4_ = fVar223 * fStack_248;
      auVar38._28_4_ = auVar193._28_4_;
      auVar39._4_4_ = fVar228 * fStack_23c;
      auVar39._0_4_ = fVar225 * local_240;
      auVar39._8_4_ = fVar224 * fStack_238;
      auVar39._12_4_ = fVar226 * fStack_234;
      auVar39._16_4_ = fVar229 * fStack_230;
      auVar39._20_4_ = fVar113 * fStack_22c;
      auVar39._24_4_ = fVar114 * fStack_228;
      auVar39._28_4_ = fVar110;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar178 * fStack_67c;
      auVar40._0_4_ = fVar112 * local_680;
      auVar40._8_4_ = fVar194 * fStack_678;
      auVar40._12_4_ = fVar196 * fStack_674;
      auVar40._16_4_ = fVar198 * fStack_670;
      auVar40._20_4_ = fVar201 * fStack_66c;
      auVar40._24_4_ = fVar223 * fStack_668;
      auVar40._28_4_ = fVar110;
      auVar41._4_4_ = fVar228 * fStack_6bc;
      auVar41._0_4_ = fVar225 * local_6c0;
      auVar41._8_4_ = fVar224 * fStack_6b8;
      auVar41._12_4_ = fVar226 * fStack_6b4;
      auVar41._16_4_ = fVar229 * fStack_6b0;
      auVar41._20_4_ = fVar113 * fStack_6ac;
      auVar41._24_4_ = fVar114 * fStack_6a8;
      auVar41._28_4_ = auVar16._28_4_;
      auVar105 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_220._4_4_ * fVar178;
      auVar42._0_4_ = local_220._0_4_ * fVar112;
      auVar42._8_4_ = local_220._8_4_ * fVar194;
      auVar42._12_4_ = local_220._12_4_ * fVar196;
      auVar42._16_4_ = local_220._16_4_ * fVar198;
      auVar42._20_4_ = local_220._20_4_ * fVar201;
      auVar42._24_4_ = local_220._24_4_ * fVar223;
      auVar42._28_4_ = auVar16._28_4_;
      auVar43._4_4_ = auVar103._4_4_ * fVar228;
      auVar43._0_4_ = auVar103._0_4_ * fVar225;
      auVar43._8_4_ = auVar103._8_4_ * fVar224;
      auVar43._12_4_ = auVar103._12_4_ * fVar226;
      auVar43._16_4_ = auVar103._16_4_ * fVar229;
      auVar43._20_4_ = auVar103._20_4_ * fVar113;
      uVar4 = auVar103._28_4_;
      auVar43._24_4_ = auVar103._24_4_ * fVar114;
      auVar43._28_4_ = uVar4;
      auVar103 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar301._4_4_ * fVar178;
      auVar44._0_4_ = auVar301._0_4_ * fVar112;
      auVar44._8_4_ = auVar301._8_4_ * fVar194;
      auVar44._12_4_ = auVar301._12_4_ * fVar196;
      auVar44._16_4_ = auVar301._16_4_ * fVar198;
      auVar44._20_4_ = auVar301._20_4_ * fVar201;
      auVar44._24_4_ = auVar301._24_4_ * fVar223;
      auVar44._28_4_ = uVar4;
      auVar45._4_4_ = auVar271._4_4_ * fVar228;
      auVar45._0_4_ = auVar271._0_4_ * fVar225;
      auVar45._8_4_ = auVar271._8_4_ * fVar224;
      auVar45._12_4_ = auVar271._12_4_ * fVar226;
      auVar45._16_4_ = auVar271._16_4_ * fVar229;
      auVar45._20_4_ = auVar271._20_4_ * fVar113;
      auVar45._24_4_ = auVar271._24_4_ * fVar114;
      auVar45._28_4_ = auVar271._28_4_;
      auVar143 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar178 * fStack_29c;
      auVar46._0_4_ = fVar112 * local_2a0;
      auVar46._8_4_ = fVar194 * fStack_298;
      auVar46._12_4_ = fVar196 * fStack_294;
      auVar46._16_4_ = fVar198 * fStack_290;
      auVar46._20_4_ = fVar201 * fStack_28c;
      auVar46._24_4_ = fVar223 * fStack_288;
      auVar46._28_4_ = uVar4;
      auVar47._4_4_ = fVar228 * fStack_27c;
      auVar47._0_4_ = fVar225 * local_280;
      auVar47._8_4_ = fVar224 * fStack_278;
      auVar47._12_4_ = fVar226 * fStack_274;
      auVar47._16_4_ = fVar229 * fStack_270;
      auVar47._20_4_ = fVar113 * fStack_26c;
      auVar47._24_4_ = fVar114 * fStack_268;
      auVar47._28_4_ = auVar301._28_4_;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar178 * auVar21._4_4_;
      auVar48._0_4_ = fVar112 * auVar21._0_4_;
      auVar48._8_4_ = fVar194 * auVar21._8_4_;
      auVar48._12_4_ = fVar196 * auVar21._12_4_;
      auVar48._16_4_ = fVar198 * auVar21._16_4_;
      auVar48._20_4_ = fVar201 * auVar21._20_4_;
      auVar48._24_4_ = fVar223 * auVar21._24_4_;
      auVar48._28_4_ = auVar301._28_4_;
      auVar49._4_4_ = fStack_5dc * fVar228;
      auVar49._0_4_ = local_5e0 * fVar225;
      auVar49._8_4_ = fStack_5d8 * fVar224;
      auVar49._12_4_ = fStack_5d4 * fVar226;
      auVar49._16_4_ = fStack_5d0 * fVar229;
      auVar49._20_4_ = fStack_5cc * fVar113;
      auVar49._24_4_ = fStack_5c8 * fVar114;
      auVar49._28_4_ = local_220._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_1e0._4_4_ * fVar178;
      auVar50._0_4_ = local_1e0._0_4_ * fVar112;
      auVar50._8_4_ = local_1e0._8_4_ * fVar194;
      auVar50._12_4_ = local_1e0._12_4_ * fVar196;
      auVar50._16_4_ = local_1e0._16_4_ * fVar198;
      auVar50._20_4_ = local_1e0._20_4_ * fVar201;
      auVar50._24_4_ = local_1e0._24_4_ * fVar223;
      auVar50._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar51._4_4_ = auVar104._4_4_ * fVar228;
      auVar51._0_4_ = auVar104._0_4_ * fVar225;
      auVar51._8_4_ = auVar104._8_4_ * fVar224;
      auVar51._12_4_ = auVar104._12_4_ * fVar226;
      auVar51._16_4_ = auVar104._16_4_ * fVar229;
      auVar51._20_4_ = auVar104._20_4_ * fVar113;
      auVar51._24_4_ = auVar104._24_4_ * fVar114;
      auVar51._28_4_ = auVar17._28_4_ + fVar110;
      auVar104 = vsubps_avx(auVar50,auVar51);
      auVar19 = vminps_avx(auVar20,auVar22);
      auVar18 = vmaxps_avx(auVar20,auVar22);
      auVar16 = vminps_avx(auVar105,auVar103);
      auVar16 = vminps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar105,auVar103);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar17 = vminps_avx(auVar143,auVar23);
      auVar19 = vmaxps_avx(auVar143,auVar23);
      auVar103 = vminps_avx(auVar21,auVar104);
      auVar17 = vminps_avx(auVar17,auVar103);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar104);
      auVar19 = vmaxps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar17,local_1c0,2);
      auVar19 = vcmpps_avx(auVar19,local_340,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar102 = vandps_avx(local_2c0,auVar102);
      auVar19 = auVar102 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar102 = vandps_avx(auVar18,auVar102);
        uVar68 = vmovmskps_avx(auVar102);
        if (uVar68 != 0) {
          uVar65 = (ulong)uVar70;
          auStack_460[uVar65] = uVar68 & 0xff;
          uVar5 = vmovlps_avx(local_400);
          *(undefined8 *)(afStack_320 + uVar65 * 2) = uVar5;
          uVar63 = vmovlps_avx(auVar74);
          auStack_1a0[uVar65] = uVar63;
          uVar70 = uVar70 + 1;
        }
      }
    }
    if (uVar70 != 0) {
      do {
        uVar65 = (ulong)(uVar70 - 1);
        uVar68 = auStack_460[uVar65];
        fVar110 = afStack_320[uVar65 * 2];
        fVar112 = afStack_320[uVar65 * 2 + 1];
        auVar349._8_8_ = 0;
        auVar349._0_8_ = auStack_1a0[uVar65];
        auVar353 = ZEXT1664(auVar349);
        uVar63 = 0;
        if (uVar68 != 0) {
          for (; (uVar68 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
          }
        }
        uVar68 = uVar68 - 1 & uVar68;
        auStack_460[uVar65] = uVar68;
        if (uVar68 == 0) {
          uVar70 = uVar70 - 1;
        }
        fVar194 = (float)(uVar63 + 1) * 0.14285715;
        fVar178 = (1.0 - (float)uVar63 * 0.14285715) * fVar110 +
                  fVar112 * (float)uVar63 * 0.14285715;
        fVar110 = (1.0 - fVar194) * fVar110 + fVar112 * fVar194;
        fVar112 = fVar110 - fVar178;
        if (0.16666667 <= fVar112) {
          auVar90 = vinsertps_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar110),0x10);
          auVar357 = ZEXT1664(auVar90);
          goto LAB_00fbc203;
        }
        auVar90 = vshufps_avx(auVar349,auVar349,0x50);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar209 = vsubps_avx(auVar125,auVar90);
        fVar194 = auVar90._0_4_;
        fVar196 = auVar90._4_4_;
        fVar198 = auVar90._8_4_;
        fVar201 = auVar90._12_4_;
        fVar223 = auVar209._0_4_;
        fVar225 = auVar209._4_4_;
        fVar228 = auVar209._8_4_;
        fVar224 = auVar209._12_4_;
        auVar158._0_4_ = fVar194 * auVar332._0_4_ + fVar223 * fVar243;
        auVar158._4_4_ = fVar196 * auVar332._4_4_ + fVar225 * fVar179;
        auVar158._8_4_ = fVar198 * auVar332._0_4_ + fVar228 * fVar243;
        auVar158._12_4_ = fVar201 * auVar332._4_4_ + fVar224 * fVar179;
        auVar211._0_4_ = auVar296._0_4_ * fVar194 + fVar223 * auVar124._0_4_;
        auVar211._4_4_ = auVar296._4_4_ * fVar196 + fVar225 * auVar124._4_4_;
        auVar211._8_4_ = auVar296._0_4_ * fVar198 + fVar228 * auVar124._0_4_;
        auVar211._12_4_ = auVar296._4_4_ * fVar201 + fVar224 * auVar124._4_4_;
        auVar234._0_4_ = auVar314._0_4_ * fVar194 + auVar344._0_4_ * fVar223;
        auVar234._4_4_ = auVar314._4_4_ * fVar196 + auVar344._4_4_ * fVar225;
        auVar234._8_4_ = auVar314._0_4_ * fVar198 + auVar344._0_4_ * fVar228;
        auVar234._12_4_ = auVar314._4_4_ * fVar201 + auVar344._4_4_ * fVar224;
        auVar87._0_4_ = auVar85._0_4_ * fVar194 + auVar267._0_4_ * fVar223;
        auVar87._4_4_ = auVar85._4_4_ * fVar196 + auVar267._4_4_ * fVar225;
        auVar87._8_4_ = auVar85._0_4_ * fVar198 + auVar267._0_4_ * fVar228;
        auVar87._12_4_ = auVar85._4_4_ * fVar201 + auVar267._4_4_ * fVar224;
        auVar144._16_16_ = auVar158;
        auVar144._0_16_ = auVar158;
        auVar175._16_16_ = auVar211;
        auVar175._0_16_ = auVar211;
        auVar222._16_16_ = auVar234;
        auVar222._0_16_ = auVar234;
        auVar102 = ZEXT2032(CONCAT416(fVar110,ZEXT416((uint)fVar178)));
        auVar102 = vshufps_avx(auVar102,auVar102,0);
        auVar18 = vsubps_avx(auVar175,auVar144);
        fVar194 = auVar102._0_4_;
        fVar196 = auVar102._4_4_;
        fVar198 = auVar102._8_4_;
        fVar201 = auVar102._12_4_;
        fVar223 = auVar102._16_4_;
        fVar225 = auVar102._20_4_;
        fVar228 = auVar102._24_4_;
        auVar145._0_4_ = auVar158._0_4_ + auVar18._0_4_ * fVar194;
        auVar145._4_4_ = auVar158._4_4_ + auVar18._4_4_ * fVar196;
        auVar145._8_4_ = auVar158._8_4_ + auVar18._8_4_ * fVar198;
        auVar145._12_4_ = auVar158._12_4_ + auVar18._12_4_ * fVar201;
        auVar145._16_4_ = auVar158._0_4_ + auVar18._16_4_ * fVar223;
        auVar145._20_4_ = auVar158._4_4_ + auVar18._20_4_ * fVar225;
        auVar145._24_4_ = auVar158._8_4_ + auVar18._24_4_ * fVar228;
        auVar145._28_4_ = auVar158._12_4_ + auVar18._28_4_;
        auVar102 = vsubps_avx(auVar222,auVar175);
        auVar176._0_4_ = auVar211._0_4_ + auVar102._0_4_ * fVar194;
        auVar176._4_4_ = auVar211._4_4_ + auVar102._4_4_ * fVar196;
        auVar176._8_4_ = auVar211._8_4_ + auVar102._8_4_ * fVar198;
        auVar176._12_4_ = auVar211._12_4_ + auVar102._12_4_ * fVar201;
        auVar176._16_4_ = auVar211._0_4_ + auVar102._16_4_ * fVar223;
        auVar176._20_4_ = auVar211._4_4_ + auVar102._20_4_ * fVar225;
        auVar176._24_4_ = auVar211._8_4_ + auVar102._24_4_ * fVar228;
        auVar176._28_4_ = auVar211._12_4_ + auVar102._28_4_;
        auVar90 = vsubps_avx(auVar87,auVar234);
        auVar106._0_4_ = auVar234._0_4_ + auVar90._0_4_ * fVar194;
        auVar106._4_4_ = auVar234._4_4_ + auVar90._4_4_ * fVar196;
        auVar106._8_4_ = auVar234._8_4_ + auVar90._8_4_ * fVar198;
        auVar106._12_4_ = auVar234._12_4_ + auVar90._12_4_ * fVar201;
        auVar106._16_4_ = auVar234._0_4_ + auVar90._0_4_ * fVar223;
        auVar106._20_4_ = auVar234._4_4_ + auVar90._4_4_ * fVar225;
        auVar106._24_4_ = auVar234._8_4_ + auVar90._8_4_ * fVar228;
        auVar106._28_4_ = auVar234._12_4_ + auVar90._12_4_;
        auVar102 = vsubps_avx(auVar176,auVar145);
        auVar146._0_4_ = auVar145._0_4_ + fVar194 * auVar102._0_4_;
        auVar146._4_4_ = auVar145._4_4_ + fVar196 * auVar102._4_4_;
        auVar146._8_4_ = auVar145._8_4_ + fVar198 * auVar102._8_4_;
        auVar146._12_4_ = auVar145._12_4_ + fVar201 * auVar102._12_4_;
        auVar146._16_4_ = auVar145._16_4_ + fVar223 * auVar102._16_4_;
        auVar146._20_4_ = auVar145._20_4_ + fVar225 * auVar102._20_4_;
        auVar146._24_4_ = auVar145._24_4_ + fVar228 * auVar102._24_4_;
        auVar146._28_4_ = auVar145._28_4_ + auVar102._28_4_;
        auVar102 = vsubps_avx(auVar106,auVar176);
        auVar107._0_4_ = auVar176._0_4_ + fVar194 * auVar102._0_4_;
        auVar107._4_4_ = auVar176._4_4_ + fVar196 * auVar102._4_4_;
        auVar107._8_4_ = auVar176._8_4_ + fVar198 * auVar102._8_4_;
        auVar107._12_4_ = auVar176._12_4_ + fVar201 * auVar102._12_4_;
        auVar107._16_4_ = auVar176._16_4_ + fVar223 * auVar102._16_4_;
        auVar107._20_4_ = auVar176._20_4_ + fVar225 * auVar102._20_4_;
        auVar107._24_4_ = auVar176._24_4_ + fVar228 * auVar102._24_4_;
        auVar107._28_4_ = auVar176._28_4_ + auVar102._28_4_;
        auVar102 = vsubps_avx(auVar107,auVar146);
        auVar252._0_4_ = auVar146._0_4_ + fVar194 * auVar102._0_4_;
        auVar252._4_4_ = auVar146._4_4_ + fVar196 * auVar102._4_4_;
        auVar252._8_4_ = auVar146._8_4_ + fVar198 * auVar102._8_4_;
        auVar252._12_4_ = auVar146._12_4_ + fVar201 * auVar102._12_4_;
        auVar257._16_4_ = auVar146._16_4_ + fVar223 * auVar102._16_4_;
        auVar257._0_16_ = auVar252;
        auVar257._20_4_ = auVar146._20_4_ + fVar225 * auVar102._20_4_;
        auVar257._24_4_ = auVar146._24_4_ + fVar228 * auVar102._24_4_;
        auVar257._28_4_ = auVar146._28_4_ + auVar176._28_4_;
        auVar258 = auVar257._16_16_;
        auVar127 = vshufps_avx(ZEXT416((uint)(fVar112 * 0.33333334)),
                               ZEXT416((uint)(fVar112 * 0.33333334)),0);
        auVar212._0_4_ = auVar252._0_4_ + auVar127._0_4_ * auVar102._0_4_ * 3.0;
        auVar212._4_4_ = auVar252._4_4_ + auVar127._4_4_ * auVar102._4_4_ * 3.0;
        auVar212._8_4_ = auVar252._8_4_ + auVar127._8_4_ * auVar102._8_4_ * 3.0;
        auVar212._12_4_ = auVar252._12_4_ + auVar127._12_4_ * auVar102._12_4_ * 3.0;
        auVar174 = vshufpd_avx(auVar252,auVar252,3);
        auVar139 = vshufpd_avx(auVar258,auVar258,3);
        auVar90 = vsubps_avx(auVar174,auVar252);
        auVar209 = vsubps_avx(auVar139,auVar258);
        auVar88._0_4_ = auVar90._0_4_ + auVar209._0_4_;
        auVar88._4_4_ = auVar90._4_4_ + auVar209._4_4_;
        auVar88._8_4_ = auVar90._8_4_ + auVar209._8_4_;
        auVar88._12_4_ = auVar90._12_4_ + auVar209._12_4_;
        auVar90 = vmovshdup_avx(auVar252);
        auVar209 = vmovshdup_avx(auVar212);
        auVar160 = vshufps_avx(auVar88,auVar88,0);
        auVar128 = vshufps_avx(auVar88,auVar88,0x55);
        fVar194 = auVar128._0_4_;
        fVar196 = auVar128._4_4_;
        fVar198 = auVar128._8_4_;
        fVar201 = auVar128._12_4_;
        fVar223 = auVar160._0_4_;
        fVar225 = auVar160._4_4_;
        fVar228 = auVar160._8_4_;
        fVar224 = auVar160._12_4_;
        auVar89._0_4_ = fVar223 * auVar252._0_4_ + auVar90._0_4_ * fVar194;
        auVar89._4_4_ = fVar225 * auVar252._4_4_ + auVar90._4_4_ * fVar196;
        auVar89._8_4_ = fVar228 * auVar252._8_4_ + auVar90._8_4_ * fVar198;
        auVar89._12_4_ = fVar224 * auVar252._12_4_ + auVar90._12_4_ * fVar201;
        auVar321._0_4_ = fVar223 * auVar212._0_4_ + auVar209._0_4_ * fVar194;
        auVar321._4_4_ = fVar225 * auVar212._4_4_ + auVar209._4_4_ * fVar196;
        auVar321._8_4_ = fVar228 * auVar212._8_4_ + auVar209._8_4_ * fVar198;
        auVar321._12_4_ = fVar224 * auVar212._12_4_ + auVar209._12_4_ * fVar201;
        auVar209 = vshufps_avx(auVar89,auVar89,0xe8);
        auVar160 = vshufps_avx(auVar321,auVar321,0xe8);
        auVar90 = vcmpps_avx(auVar209,auVar160,1);
        uVar68 = vextractps_avx(auVar90,0);
        auVar128 = auVar321;
        if ((uVar68 & 1) == 0) {
          auVar128 = auVar89;
        }
        auVar126._0_4_ = auVar127._0_4_ * auVar102._16_4_ * 3.0;
        auVar126._4_4_ = auVar127._4_4_ * auVar102._20_4_ * 3.0;
        auVar126._8_4_ = auVar127._8_4_ * auVar102._24_4_ * 3.0;
        auVar126._12_4_ = auVar127._12_4_ * 0.0;
        auVar73 = vsubps_avx(auVar258,auVar126);
        auVar127 = vmovshdup_avx(auVar73);
        auVar258 = vmovshdup_avx(auVar258);
        fVar226 = auVar73._0_4_;
        fVar229 = auVar73._4_4_;
        auVar235._0_4_ = fVar226 * fVar223 + auVar127._0_4_ * fVar194;
        auVar235._4_4_ = fVar229 * fVar225 + auVar127._4_4_ * fVar196;
        auVar235._8_4_ = auVar73._8_4_ * fVar228 + auVar127._8_4_ * fVar198;
        auVar235._12_4_ = auVar73._12_4_ * fVar224 + auVar127._12_4_ * fVar201;
        auVar356._0_4_ = fVar223 * auVar257._16_4_ + auVar258._0_4_ * fVar194;
        auVar356._4_4_ = fVar225 * auVar257._20_4_ + auVar258._4_4_ * fVar196;
        auVar356._8_4_ = fVar228 * auVar257._24_4_ + auVar258._8_4_ * fVar198;
        auVar356._12_4_ = fVar224 * auVar257._28_4_ + auVar258._12_4_ * fVar201;
        auVar258 = vshufps_avx(auVar235,auVar235,0xe8);
        auVar72 = vshufps_avx(auVar356,auVar356,0xe8);
        auVar127 = vcmpps_avx(auVar258,auVar72,1);
        uVar68 = vextractps_avx(auVar127,0);
        auVar74 = auVar356;
        if ((uVar68 & 1) == 0) {
          auVar74 = auVar235;
        }
        auVar128 = vmaxss_avx(auVar74,auVar128);
        auVar209 = vminps_avx(auVar209,auVar160);
        auVar160 = vminps_avx(auVar258,auVar72);
        auVar160 = vminps_avx(auVar209,auVar160);
        auVar90 = vshufps_avx(auVar90,auVar90,0x55);
        auVar90 = vblendps_avx(auVar90,auVar127,2);
        auVar127 = vpslld_avx(auVar90,0x1f);
        auVar90 = vshufpd_avx(auVar321,auVar321,1);
        auVar90 = vinsertps_avx(auVar90,auVar356,0x9c);
        auVar209 = vshufpd_avx(auVar89,auVar89,1);
        auVar209 = vinsertps_avx(auVar209,auVar235,0x9c);
        auVar90 = vblendvps_avx(auVar209,auVar90,auVar127);
        auVar209 = vmovshdup_avx(auVar90);
        auVar90 = vmaxss_avx(auVar209,auVar90);
        fVar198 = auVar160._0_4_;
        auVar209 = vmovshdup_avx(auVar160);
        fVar196 = auVar90._0_4_;
        fVar201 = auVar209._0_4_;
        fVar194 = auVar128._0_4_;
        if ((0.0001 <= fVar198) || (fVar196 <= -0.0001)) {
          if ((fVar201 < 0.0001 && -0.0001 < fVar194) || (fVar198 < 0.0001 && -0.0001 < fVar194))
          goto LAB_00fbcc12;
          auVar127 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar90,1);
          auVar209 = vcmpps_avx(auVar209,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar209 = vandps_avx(auVar209,auVar127);
          if ((auVar209 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00fbcc12;
        }
        else {
LAB_00fbcc12:
          auVar127 = vcmpps_avx(auVar160,_DAT_01f7aa10,1);
          auVar209 = vcmpss_avx(auVar128,ZEXT416(0) << 0x20,1);
          auVar159._8_4_ = 0x3f800000;
          auVar159._0_8_ = 0x3f8000003f800000;
          auVar159._12_4_ = 0x3f800000;
          auVar213._8_4_ = 0xbf800000;
          auVar213._0_8_ = 0xbf800000bf800000;
          auVar213._12_4_ = 0xbf800000;
          auVar209 = vblendvps_avx(auVar159,auVar213,auVar209);
          auVar127 = vblendvps_avx(auVar159,auVar213,auVar127);
          auVar160 = vcmpss_avx(auVar127,auVar209,4);
          auVar160 = vpshufd_avx(ZEXT416(auVar160._0_4_ & 1),0x50);
          auVar160 = vpslld_avx(auVar160,0x1f);
          auVar160 = vpsrad_avx(auVar160,0x1f);
          auVar160 = vpandn_avx(auVar160,_DAT_01fafeb0);
          auVar128 = vmovshdup_avx(auVar127);
          fVar223 = auVar128._0_4_;
          if ((auVar127._0_4_ != fVar223) || (NAN(auVar127._0_4_) || NAN(fVar223))) {
            if ((fVar201 != fVar198) || (NAN(fVar201) || NAN(fVar198))) {
              fVar198 = -fVar198 / (fVar201 - fVar198);
              auVar127 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar198) * 0.0 + fVar198)));
            }
            else {
              auVar127 = ZEXT816(0x3f80000000000000);
              if ((fVar198 != 0.0) || (NAN(fVar198))) {
                auVar127 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar258 = vcmpps_avx(auVar160,auVar127,1);
            auVar128 = vblendps_avx(auVar160,auVar127,2);
            auVar127 = vblendps_avx(auVar127,auVar160,2);
            auVar160 = vblendvps_avx(auVar127,auVar128,auVar258);
          }
          auVar90 = vcmpss_avx(auVar90,ZEXT416(0) << 0x20,1);
          auVar161._8_4_ = 0x3f800000;
          auVar161._0_8_ = 0x3f8000003f800000;
          auVar161._12_4_ = 0x3f800000;
          auVar214._8_4_ = 0xbf800000;
          auVar214._0_8_ = 0xbf800000bf800000;
          auVar214._12_4_ = 0xbf800000;
          auVar90 = vblendvps_avx(auVar161,auVar214,auVar90);
          fVar198 = auVar90._0_4_;
          if ((auVar209._0_4_ != fVar198) || (NAN(auVar209._0_4_) || NAN(fVar198))) {
            if ((fVar196 != fVar194) || (NAN(fVar196) || NAN(fVar194))) {
              fVar194 = -fVar194 / (fVar196 - fVar194);
              auVar90 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar194) * 0.0 + fVar194)));
            }
            else {
              auVar90 = ZEXT816(0x3f80000000000000);
              if ((fVar194 != 0.0) || (NAN(fVar194))) {
                auVar90 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar127 = vcmpps_avx(auVar160,auVar90,1);
            auVar209 = vblendps_avx(auVar160,auVar90,2);
            auVar90 = vblendps_avx(auVar90,auVar160,2);
            auVar160 = vblendvps_avx(auVar90,auVar209,auVar127);
          }
          if ((fVar223 != fVar198) || (NAN(fVar223) || NAN(fVar198))) {
            auVar91._8_4_ = 0x3f800000;
            auVar91._0_8_ = 0x3f8000003f800000;
            auVar91._12_4_ = 0x3f800000;
            auVar90 = vcmpps_avx(auVar160,auVar91,1);
            auVar209 = vinsertps_avx(auVar160,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar162._4_12_ = auVar160._4_12_;
            auVar162._0_4_ = 0x3f800000;
            auVar160 = vblendvps_avx(auVar162,auVar209,auVar90);
          }
          auVar90 = vcmpps_avx(auVar160,_DAT_01f7b6f0,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar160._4_12_;
          auVar209 = vinsertps_avx(auVar160,ZEXT416(0x3f800000),0x10);
          auVar90 = vblendvps_avx(auVar209,auVar54 << 0x20,auVar90);
          auVar209 = vmovshdup_avx(auVar90);
          if (auVar90._0_4_ <= auVar209._0_4_) {
            auVar92._0_4_ = auVar90._0_4_ + -0.1;
            auVar92._4_4_ = auVar90._4_4_ + 0.1;
            auVar92._8_4_ = auVar90._8_4_ + 0.0;
            auVar92._12_4_ = auVar90._12_4_ + 0.0;
            auVar127 = vshufpd_avx(auVar212,auVar212,3);
            auVar253._8_8_ = 0x3f80000000000000;
            auVar253._0_8_ = 0x3f80000000000000;
            auVar90 = vcmpps_avx(auVar92,auVar253,1);
            auVar52._12_4_ = 0;
            auVar52._0_12_ = auVar92._4_12_;
            auVar209 = vinsertps_avx(auVar92,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar90 = vblendvps_avx(auVar209,auVar52 << 0x20,auVar90);
            auVar209 = vshufpd_avx(auVar73,auVar73,3);
            auVar160 = vshufps_avx(auVar90,auVar90,0x50);
            auVar254._8_4_ = 0x3f800000;
            auVar254._0_8_ = 0x3f8000003f800000;
            auVar254._12_4_ = 0x3f800000;
            auVar128 = vsubps_avx(auVar254,auVar160);
            local_5c0 = auVar174._0_4_;
            fStack_5bc = auVar174._4_4_;
            fStack_5b8 = auVar174._8_4_;
            fStack_5b4 = auVar174._12_4_;
            fVar194 = auVar160._0_4_;
            fVar196 = auVar160._4_4_;
            fVar198 = auVar160._8_4_;
            fVar201 = auVar160._12_4_;
            local_6a0 = auVar139._0_4_;
            fStack_69c = auVar139._4_4_;
            fStack_698 = auVar139._8_4_;
            fStack_694 = auVar139._12_4_;
            fVar223 = auVar128._0_4_;
            fVar225 = auVar128._4_4_;
            fVar228 = auVar128._8_4_;
            fVar224 = auVar128._12_4_;
            auVar93._0_4_ = fVar194 * local_5c0 + fVar223 * auVar252._0_4_;
            auVar93._4_4_ = fVar196 * fStack_5bc + fVar225 * auVar252._4_4_;
            auVar93._8_4_ = fVar198 * fStack_5b8 + fVar228 * auVar252._0_4_;
            auVar93._12_4_ = fVar201 * fStack_5b4 + fVar224 * auVar252._4_4_;
            auVar236._0_4_ = auVar127._0_4_ * fVar194 + fVar223 * auVar212._0_4_;
            auVar236._4_4_ = auVar127._4_4_ * fVar196 + fVar225 * auVar212._4_4_;
            auVar236._8_4_ = auVar127._8_4_ * fVar198 + fVar228 * auVar212._0_4_;
            auVar236._12_4_ = auVar127._12_4_ * fVar201 + fVar224 * auVar212._4_4_;
            auVar269._0_4_ = auVar209._0_4_ * fVar194 + fVar223 * fVar226;
            auVar269._4_4_ = auVar209._4_4_ * fVar196 + fVar225 * fVar229;
            auVar269._8_4_ = auVar209._8_4_ * fVar198 + fVar228 * fVar226;
            auVar269._12_4_ = auVar209._12_4_ * fVar201 + fVar224 * fVar229;
            auVar315._0_4_ = fVar194 * local_6a0 + fVar223 * auVar257._16_4_;
            auVar315._4_4_ = fVar196 * fStack_69c + fVar225 * auVar257._20_4_;
            auVar315._8_4_ = fVar198 * fStack_698 + fVar228 * auVar257._16_4_;
            auVar315._12_4_ = fVar201 * fStack_694 + fVar224 * auVar257._20_4_;
            auVar139 = vsubps_avx(auVar254,auVar90);
            auVar209 = vmovshdup_avx(auVar349);
            auVar174 = vmovsldup_avx(auVar349);
            auVar255._0_4_ = auVar139._0_4_ * auVar174._0_4_ + auVar90._0_4_ * auVar209._0_4_;
            auVar255._4_4_ = auVar139._4_4_ * auVar174._4_4_ + auVar90._4_4_ * auVar209._4_4_;
            auVar255._8_4_ = auVar139._8_4_ * auVar174._8_4_ + auVar90._8_4_ * auVar209._8_4_;
            auVar255._12_4_ = auVar139._12_4_ * auVar174._12_4_ + auVar90._12_4_ * auVar209._12_4_;
            auVar73 = vmovshdup_avx(auVar255);
            auVar90 = vsubps_avx(auVar236,auVar93);
            auVar163._0_4_ = auVar90._0_4_ * 3.0;
            auVar163._4_4_ = auVar90._4_4_ * 3.0;
            auVar163._8_4_ = auVar90._8_4_ * 3.0;
            auVar163._12_4_ = auVar90._12_4_ * 3.0;
            auVar90 = vsubps_avx(auVar269,auVar236);
            auVar190._0_4_ = auVar90._0_4_ * 3.0;
            auVar190._4_4_ = auVar90._4_4_ * 3.0;
            auVar190._8_4_ = auVar90._8_4_ * 3.0;
            auVar190._12_4_ = auVar90._12_4_ * 3.0;
            auVar90 = vsubps_avx(auVar315,auVar269);
            auVar285._0_4_ = auVar90._0_4_ * 3.0;
            auVar285._4_4_ = auVar90._4_4_ * 3.0;
            auVar285._8_4_ = auVar90._8_4_ * 3.0;
            auVar285._12_4_ = auVar90._12_4_ * 3.0;
            auVar209 = vminps_avx(auVar190,auVar285);
            auVar90 = vmaxps_avx(auVar190,auVar285);
            auVar209 = vminps_avx(auVar163,auVar209);
            auVar90 = vmaxps_avx(auVar163,auVar90);
            auVar174 = vshufpd_avx(auVar209,auVar209,3);
            auVar139 = vshufpd_avx(auVar90,auVar90,3);
            auVar209 = vminps_avx(auVar209,auVar174);
            auVar90 = vmaxps_avx(auVar90,auVar139);
            auVar174 = vshufps_avx(ZEXT416((uint)(1.0 / fVar112)),ZEXT416((uint)(1.0 / fVar112)),0);
            auVar286._0_4_ = auVar174._0_4_ * auVar209._0_4_;
            auVar286._4_4_ = auVar174._4_4_ * auVar209._4_4_;
            auVar286._8_4_ = auVar174._8_4_ * auVar209._8_4_;
            auVar286._12_4_ = auVar174._12_4_ * auVar209._12_4_;
            auVar297._0_4_ = auVar174._0_4_ * auVar90._0_4_;
            auVar297._4_4_ = auVar174._4_4_ * auVar90._4_4_;
            auVar297._8_4_ = auVar174._8_4_ * auVar90._8_4_;
            auVar297._12_4_ = auVar174._12_4_ * auVar90._12_4_;
            auVar128 = ZEXT416((uint)(1.0 / (auVar73._0_4_ - auVar255._0_4_)));
            auVar90 = vshufpd_avx(auVar93,auVar93,3);
            auVar209 = vshufpd_avx(auVar236,auVar236,3);
            auVar174 = vshufpd_avx(auVar269,auVar269,3);
            auVar139 = vshufpd_avx(auVar315,auVar315,3);
            auVar90 = vsubps_avx(auVar90,auVar93);
            auVar127 = vsubps_avx(auVar209,auVar236);
            auVar160 = vsubps_avx(auVar174,auVar269);
            auVar139 = vsubps_avx(auVar139,auVar315);
            auVar209 = vminps_avx(auVar90,auVar127);
            auVar90 = vmaxps_avx(auVar90,auVar127);
            auVar174 = vminps_avx(auVar160,auVar139);
            auVar174 = vminps_avx(auVar209,auVar174);
            auVar209 = vmaxps_avx(auVar160,auVar139);
            auVar90 = vmaxps_avx(auVar90,auVar209);
            auVar209 = vshufps_avx(auVar128,auVar128,0);
            auVar345._0_4_ = auVar209._0_4_ * auVar174._0_4_;
            auVar345._4_4_ = auVar209._4_4_ * auVar174._4_4_;
            auVar345._8_4_ = auVar209._8_4_ * auVar174._8_4_;
            auVar345._12_4_ = auVar209._12_4_ * auVar174._12_4_;
            auVar350._0_4_ = auVar209._0_4_ * auVar90._0_4_;
            auVar350._4_4_ = auVar209._4_4_ * auVar90._4_4_;
            auVar350._8_4_ = auVar209._8_4_ * auVar90._8_4_;
            auVar350._12_4_ = auVar209._12_4_ * auVar90._12_4_;
            auVar90 = vmovsldup_avx(auVar255);
            auVar316._4_12_ = auVar90._4_12_;
            auVar316._0_4_ = fVar178;
            auVar322._4_12_ = auVar255._4_12_;
            auVar322._0_4_ = fVar110;
            auVar191._0_4_ = (fVar178 + fVar110) * 0.5;
            auVar191._4_4_ = (auVar90._4_4_ + auVar255._4_4_) * 0.5;
            auVar191._8_4_ = (auVar90._8_4_ + auVar255._8_4_) * 0.5;
            auVar191._12_4_ = (auVar90._12_4_ + auVar255._12_4_) * 0.5;
            auVar90 = vshufps_avx(auVar191,auVar191,0);
            fVar194 = auVar90._0_4_;
            fVar196 = auVar90._4_4_;
            fVar198 = auVar90._8_4_;
            fVar201 = auVar90._12_4_;
            local_6d0._0_4_ = auVar282._0_4_;
            local_6d0._4_4_ = auVar282._4_4_;
            fStack_6c8 = auVar282._8_4_;
            fStack_6c4 = auVar282._12_4_;
            auVar129._0_4_ = fVar194 * (float)local_350._0_4_ + (float)local_6d0._0_4_;
            auVar129._4_4_ = fVar196 * (float)local_350._4_4_ + (float)local_6d0._4_4_;
            auVar129._8_4_ = fVar198 * fStack_348 + fStack_6c8;
            auVar129._12_4_ = fVar201 * fStack_344 + fStack_6c4;
            local_6e0._0_4_ = auVar249._0_4_;
            local_6e0._4_4_ = auVar249._4_4_;
            fStack_6d8 = auVar249._8_4_;
            fStack_6d4 = auVar249._12_4_;
            auVar164._0_4_ = fVar194 * (float)local_360._0_4_ + (float)local_6e0._0_4_;
            auVar164._4_4_ = fVar196 * (float)local_360._4_4_ + (float)local_6e0._4_4_;
            auVar164._8_4_ = fVar198 * fStack_358 + fStack_6d8;
            auVar164._12_4_ = fVar201 * fStack_354 + fStack_6d4;
            local_6f0 = auVar14._0_4_;
            fStack_6ec = auVar14._4_4_;
            fStack_6e8 = auVar14._8_4_;
            fStack_6e4 = auVar14._12_4_;
            auVar237._0_4_ = fVar194 * (float)local_370._0_4_ + local_6f0;
            auVar237._4_4_ = fVar196 * (float)local_370._4_4_ + fStack_6ec;
            auVar237._8_4_ = fVar198 * fStack_368 + fStack_6e8;
            auVar237._12_4_ = fVar201 * fStack_364 + fStack_6e4;
            auVar90 = vsubps_avx(auVar164,auVar129);
            auVar130._0_4_ = auVar129._0_4_ + fVar194 * auVar90._0_4_;
            auVar130._4_4_ = auVar129._4_4_ + fVar196 * auVar90._4_4_;
            auVar130._8_4_ = auVar129._8_4_ + fVar198 * auVar90._8_4_;
            auVar130._12_4_ = auVar129._12_4_ + fVar201 * auVar90._12_4_;
            auVar90 = vsubps_avx(auVar237,auVar164);
            auVar165._0_4_ = auVar164._0_4_ + fVar194 * auVar90._0_4_;
            auVar165._4_4_ = auVar164._4_4_ + fVar196 * auVar90._4_4_;
            auVar165._8_4_ = auVar164._8_4_ + fVar198 * auVar90._8_4_;
            auVar165._12_4_ = auVar164._12_4_ + fVar201 * auVar90._12_4_;
            auVar90 = vsubps_avx(auVar165,auVar130);
            fVar194 = auVar130._0_4_ + fVar194 * auVar90._0_4_;
            fVar196 = auVar130._4_4_ + fVar196 * auVar90._4_4_;
            auVar94._0_8_ = CONCAT44(fVar196,fVar194);
            auVar94._8_4_ = auVar130._8_4_ + fVar198 * auVar90._8_4_;
            auVar94._12_4_ = auVar130._12_4_ + fVar201 * auVar90._12_4_;
            fVar198 = auVar90._0_4_ * 3.0;
            fVar201 = auVar90._4_4_ * 3.0;
            auVar131._0_8_ = CONCAT44(fVar201,fVar198);
            auVar131._8_4_ = auVar90._8_4_ * 3.0;
            auVar131._12_4_ = auVar90._12_4_ * 3.0;
            auVar166._8_8_ = auVar94._0_8_;
            auVar166._0_8_ = auVar94._0_8_;
            auVar90 = vshufpd_avx(auVar94,auVar94,3);
            auVar209 = vshufps_avx(auVar191,auVar191,0x55);
            auVar160 = vsubps_avx(auVar90,auVar166);
            auVar333._0_4_ = auVar160._0_4_ * auVar209._0_4_ + fVar194;
            auVar333._4_4_ = auVar160._4_4_ * auVar209._4_4_ + fVar196;
            auVar333._8_4_ = auVar160._8_4_ * auVar209._8_4_ + fVar194;
            auVar333._12_4_ = auVar160._12_4_ * auVar209._12_4_ + fVar196;
            auVar167._8_8_ = auVar131._0_8_;
            auVar167._0_8_ = auVar131._0_8_;
            auVar90 = vshufpd_avx(auVar131,auVar131,1);
            auVar90 = vsubps_avx(auVar90,auVar167);
            auVar132._0_4_ = auVar90._0_4_ * auVar209._0_4_ + fVar198;
            auVar132._4_4_ = auVar90._4_4_ * auVar209._4_4_ + fVar201;
            auVar132._8_4_ = auVar90._8_4_ * auVar209._8_4_ + fVar198;
            auVar132._12_4_ = auVar90._12_4_ * auVar209._12_4_ + fVar201;
            auVar209 = vmovshdup_avx(auVar132);
            auVar238._0_8_ = auVar209._0_8_ ^ 0x8000000080000000;
            auVar238._8_4_ = auVar209._8_4_ ^ 0x80000000;
            auVar238._12_4_ = auVar209._12_4_ ^ 0x80000000;
            auVar174 = vmovshdup_avx(auVar160);
            auVar90 = vunpcklps_avx(auVar174,auVar238);
            auVar139 = vshufps_avx(auVar90,auVar238,4);
            auVar95._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
            auVar95._8_4_ = -auVar160._8_4_;
            auVar95._12_4_ = -auVar160._12_4_;
            auVar90 = vmovlhps_avx(auVar95,auVar132);
            auVar127 = vshufps_avx(auVar90,auVar132,8);
            auVar90 = ZEXT416((uint)(auVar132._0_4_ * auVar174._0_4_ -
                                    auVar160._0_4_ * auVar209._0_4_));
            auVar209 = vshufps_avx(auVar90,auVar90,0);
            auVar90 = vdivps_avx(auVar139,auVar209);
            auVar209 = vdivps_avx(auVar127,auVar209);
            auVar127 = vinsertps_avx(auVar286,auVar345,0x1c);
            auVar160 = vinsertps_avx(auVar297,auVar350,0x1c);
            auVar128 = vinsertps_avx(auVar345,auVar286,0x4c);
            auVar258 = vinsertps_avx(auVar350,auVar297,0x4c);
            auVar174 = vmovsldup_avx(auVar90);
            auVar168._0_4_ = auVar174._0_4_ * auVar127._0_4_;
            auVar168._4_4_ = auVar174._4_4_ * auVar127._4_4_;
            auVar168._8_4_ = auVar174._8_4_ * auVar127._8_4_;
            auVar168._12_4_ = auVar174._12_4_ * auVar127._12_4_;
            auVar133._0_4_ = auVar160._0_4_ * auVar174._0_4_;
            auVar133._4_4_ = auVar160._4_4_ * auVar174._4_4_;
            auVar133._8_4_ = auVar160._8_4_ * auVar174._8_4_;
            auVar133._12_4_ = auVar160._12_4_ * auVar174._12_4_;
            auVar139 = vminps_avx(auVar168,auVar133);
            auVar174 = vmaxps_avx(auVar133,auVar168);
            auVar72 = vmovsldup_avx(auVar209);
            auVar351._0_4_ = auVar128._0_4_ * auVar72._0_4_;
            auVar351._4_4_ = auVar128._4_4_ * auVar72._4_4_;
            auVar351._8_4_ = auVar128._8_4_ * auVar72._8_4_;
            auVar351._12_4_ = auVar128._12_4_ * auVar72._12_4_;
            auVar169._0_4_ = auVar258._0_4_ * auVar72._0_4_;
            auVar169._4_4_ = auVar258._4_4_ * auVar72._4_4_;
            auVar169._8_4_ = auVar258._8_4_ * auVar72._8_4_;
            auVar169._12_4_ = auVar258._12_4_ * auVar72._12_4_;
            auVar72 = vminps_avx(auVar351,auVar169);
            auVar215._0_4_ = auVar139._0_4_ + auVar72._0_4_;
            auVar215._4_4_ = auVar139._4_4_ + auVar72._4_4_;
            auVar215._8_4_ = auVar139._8_4_ + auVar72._8_4_;
            auVar215._12_4_ = auVar139._12_4_ + auVar72._12_4_;
            auVar139 = vmaxps_avx(auVar169,auVar351);
            auVar72 = vsubps_avx(auVar316,auVar191);
            auVar74 = vsubps_avx(auVar322,auVar191);
            auVar134._0_4_ = auVar174._0_4_ + auVar139._0_4_;
            auVar134._4_4_ = auVar174._4_4_ + auVar139._4_4_;
            auVar134._8_4_ = auVar174._8_4_ + auVar139._8_4_;
            auVar134._12_4_ = auVar174._12_4_ + auVar139._12_4_;
            auVar170._8_8_ = 0x3f800000;
            auVar170._0_8_ = 0x3f800000;
            auVar174 = vsubps_avx(auVar170,auVar134);
            auVar139 = vsubps_avx(auVar170,auVar215);
            fVar228 = auVar72._0_4_;
            auVar216._0_4_ = fVar228 * auVar174._0_4_;
            fVar224 = auVar72._4_4_;
            auVar216._4_4_ = fVar224 * auVar174._4_4_;
            fVar226 = auVar72._8_4_;
            auVar216._8_4_ = fVar226 * auVar174._8_4_;
            fVar229 = auVar72._12_4_;
            auVar216._12_4_ = fVar229 * auVar174._12_4_;
            fVar198 = auVar74._0_4_;
            auVar135._0_4_ = fVar198 * auVar174._0_4_;
            fVar201 = auVar74._4_4_;
            auVar135._4_4_ = fVar201 * auVar174._4_4_;
            fVar223 = auVar74._8_4_;
            auVar135._8_4_ = fVar223 * auVar174._8_4_;
            fVar225 = auVar74._12_4_;
            auVar135._12_4_ = fVar225 * auVar174._12_4_;
            auVar323._0_4_ = fVar228 * auVar139._0_4_;
            auVar323._4_4_ = fVar224 * auVar139._4_4_;
            auVar323._8_4_ = fVar226 * auVar139._8_4_;
            auVar323._12_4_ = fVar229 * auVar139._12_4_;
            auVar171._0_4_ = fVar198 * auVar139._0_4_;
            auVar171._4_4_ = fVar201 * auVar139._4_4_;
            auVar171._8_4_ = fVar223 * auVar139._8_4_;
            auVar171._12_4_ = fVar225 * auVar139._12_4_;
            auVar174 = vminps_avx(auVar216,auVar323);
            auVar139 = vminps_avx(auVar135,auVar171);
            auVar72 = vminps_avx(auVar174,auVar139);
            auVar174 = vmaxps_avx(auVar323,auVar216);
            auVar139 = vmaxps_avx(auVar171,auVar135);
            auVar74 = vshufps_avx(auVar191,auVar191,0x54);
            auVar139 = vmaxps_avx(auVar139,auVar174);
            auVar116 = vshufps_avx(auVar333,auVar333,0);
            auVar117 = vshufps_avx(auVar333,auVar333,0x55);
            auVar174 = vhaddps_avx(auVar72,auVar72);
            auVar139 = vhaddps_avx(auVar139,auVar139);
            auVar192._0_4_ = auVar116._0_4_ * auVar90._0_4_ + auVar117._0_4_ * auVar209._0_4_;
            auVar192._4_4_ = auVar116._4_4_ * auVar90._4_4_ + auVar117._4_4_ * auVar209._4_4_;
            auVar192._8_4_ = auVar116._8_4_ * auVar90._8_4_ + auVar117._8_4_ * auVar209._8_4_;
            auVar192._12_4_ = auVar116._12_4_ * auVar90._12_4_ + auVar117._12_4_ * auVar209._12_4_;
            auVar72 = vsubps_avx(auVar74,auVar192);
            fVar194 = auVar72._0_4_ + auVar174._0_4_;
            fVar196 = auVar72._0_4_ + auVar139._0_4_;
            auVar174 = vmaxss_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar194));
            auVar139 = vminss_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar110));
            if (auVar174._0_4_ <= auVar139._0_4_) {
              auVar174 = vmovshdup_avx(auVar90);
              auVar96._0_4_ = auVar174._0_4_ * auVar127._0_4_;
              auVar96._4_4_ = auVar174._4_4_ * auVar127._4_4_;
              auVar96._8_4_ = auVar174._8_4_ * auVar127._8_4_;
              auVar96._12_4_ = auVar174._12_4_ * auVar127._12_4_;
              auVar136._0_4_ = auVar160._0_4_ * auVar174._0_4_;
              auVar136._4_4_ = auVar160._4_4_ * auVar174._4_4_;
              auVar136._8_4_ = auVar160._8_4_ * auVar174._8_4_;
              auVar136._12_4_ = auVar160._12_4_ * auVar174._12_4_;
              auVar139 = vminps_avx(auVar96,auVar136);
              auVar174 = vmaxps_avx(auVar136,auVar96);
              auVar127 = vmovshdup_avx(auVar209);
              auVar217._0_4_ = auVar128._0_4_ * auVar127._0_4_;
              auVar217._4_4_ = auVar128._4_4_ * auVar127._4_4_;
              auVar217._8_4_ = auVar128._8_4_ * auVar127._8_4_;
              auVar217._12_4_ = auVar128._12_4_ * auVar127._12_4_;
              auVar137._0_4_ = auVar258._0_4_ * auVar127._0_4_;
              auVar137._4_4_ = auVar258._4_4_ * auVar127._4_4_;
              auVar137._8_4_ = auVar258._8_4_ * auVar127._8_4_;
              auVar137._12_4_ = auVar258._12_4_ * auVar127._12_4_;
              auVar127 = vminps_avx(auVar217,auVar137);
              auVar172._0_4_ = auVar139._0_4_ + auVar127._0_4_;
              auVar172._4_4_ = auVar139._4_4_ + auVar127._4_4_;
              auVar172._8_4_ = auVar139._8_4_ + auVar127._8_4_;
              auVar172._12_4_ = auVar139._12_4_ + auVar127._12_4_;
              auVar139 = vmaxps_avx(auVar137,auVar217);
              auVar97._0_4_ = auVar174._0_4_ + auVar139._0_4_;
              auVar97._4_4_ = auVar174._4_4_ + auVar139._4_4_;
              auVar97._8_4_ = auVar174._8_4_ + auVar139._8_4_;
              auVar97._12_4_ = auVar174._12_4_ + auVar139._12_4_;
              auVar174 = vsubps_avx(auVar253,auVar97);
              auVar139 = vsubps_avx(auVar253,auVar172);
              auVar173._0_4_ = fVar228 * auVar174._0_4_;
              auVar173._4_4_ = fVar224 * auVar174._4_4_;
              auVar173._8_4_ = fVar226 * auVar174._8_4_;
              auVar173._12_4_ = fVar229 * auVar174._12_4_;
              auVar218._0_4_ = fVar228 * auVar139._0_4_;
              auVar218._4_4_ = fVar224 * auVar139._4_4_;
              auVar218._8_4_ = fVar226 * auVar139._8_4_;
              auVar218._12_4_ = fVar229 * auVar139._12_4_;
              auVar98._0_4_ = fVar198 * auVar174._0_4_;
              auVar98._4_4_ = fVar201 * auVar174._4_4_;
              auVar98._8_4_ = fVar223 * auVar174._8_4_;
              auVar98._12_4_ = fVar225 * auVar174._12_4_;
              auVar138._0_4_ = fVar198 * auVar139._0_4_;
              auVar138._4_4_ = fVar201 * auVar139._4_4_;
              auVar138._8_4_ = fVar223 * auVar139._8_4_;
              auVar138._12_4_ = fVar225 * auVar139._12_4_;
              auVar174 = vminps_avx(auVar173,auVar218);
              auVar139 = vminps_avx(auVar98,auVar138);
              auVar174 = vminps_avx(auVar174,auVar139);
              auVar139 = vmaxps_avx(auVar218,auVar173);
              auVar127 = vmaxps_avx(auVar138,auVar98);
              auVar174 = vhaddps_avx(auVar174,auVar174);
              auVar139 = vmaxps_avx(auVar127,auVar139);
              auVar139 = vhaddps_avx(auVar139,auVar139);
              auVar127 = vmovshdup_avx(auVar72);
              auVar160 = ZEXT416((uint)(auVar127._0_4_ + auVar174._0_4_));
              auVar174 = vmaxss_avx(auVar255,auVar160);
              auVar127 = ZEXT416((uint)(auVar127._0_4_ + auVar139._0_4_));
              auVar139 = vminss_avx(auVar127,auVar73);
              if (auVar174._0_4_ <= auVar139._0_4_) {
                bVar66 = 0;
                if ((fVar178 < fVar194) && (fVar196 < fVar110)) {
                  auVar174 = vcmpps_avx(auVar127,auVar73,1);
                  auVar139 = vcmpps_avx(auVar255,auVar160,1);
                  auVar174 = vandps_avx(auVar139,auVar174);
                  bVar66 = auVar174[0];
                }
                auVar353 = ZEXT1664(auVar255);
                if ((uVar70 < 4 && 0.001 <= fVar112) && (bVar66 & 1) == 0) goto LAB_00fbda27;
                lVar64 = 200;
                do {
                  fVar112 = auVar72._0_4_;
                  fVar110 = 1.0 - fVar112;
                  auVar174 = ZEXT416((uint)(fVar110 * fVar110 * fVar110));
                  auVar174 = vshufps_avx(auVar174,auVar174,0);
                  auVar139 = ZEXT416((uint)(fVar112 * 3.0 * fVar110 * fVar110));
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  auVar127 = ZEXT416((uint)(fVar110 * fVar112 * fVar112 * 3.0));
                  auVar127 = vshufps_avx(auVar127,auVar127,0);
                  auVar160 = ZEXT416((uint)(fVar112 * fVar112 * fVar112));
                  auVar160 = vshufps_avx(auVar160,auVar160,0);
                  local_5f0._0_4_ = auVar15._0_4_;
                  local_5f0._4_4_ = auVar15._4_4_;
                  fStack_5e8 = auVar15._8_4_;
                  fStack_5e4 = auVar15._12_4_;
                  fVar110 = auVar174._0_4_ * (float)local_6d0._0_4_ +
                            auVar139._0_4_ * (float)local_6e0._0_4_ +
                            auVar160._0_4_ * (float)local_5f0._0_4_ + auVar127._0_4_ * local_6f0;
                  fVar112 = auVar174._4_4_ * (float)local_6d0._4_4_ +
                            auVar139._4_4_ * (float)local_6e0._4_4_ +
                            auVar160._4_4_ * (float)local_5f0._4_4_ + auVar127._4_4_ * fStack_6ec;
                  auVar99._0_8_ = CONCAT44(fVar112,fVar110);
                  auVar99._8_4_ =
                       auVar174._8_4_ * fStack_6c8 +
                       auVar139._8_4_ * fStack_6d8 +
                       auVar160._8_4_ * fStack_5e8 + auVar127._8_4_ * fStack_6e8;
                  auVar99._12_4_ =
                       auVar174._12_4_ * fStack_6c4 +
                       auVar139._12_4_ * fStack_6d4 +
                       auVar160._12_4_ * fStack_5e4 + auVar127._12_4_ * fStack_6e4;
                  auVar140._8_8_ = auVar99._0_8_;
                  auVar140._0_8_ = auVar99._0_8_;
                  auVar139 = vshufpd_avx(auVar99,auVar99,1);
                  auVar174 = vmovshdup_avx(auVar72);
                  auVar139 = vsubps_avx(auVar139,auVar140);
                  auVar100._0_4_ = auVar174._0_4_ * auVar139._0_4_ + fVar110;
                  auVar100._4_4_ = auVar174._4_4_ * auVar139._4_4_ + fVar112;
                  auVar100._8_4_ = auVar174._8_4_ * auVar139._8_4_ + fVar110;
                  auVar100._12_4_ = auVar174._12_4_ * auVar139._12_4_ + fVar112;
                  auVar174 = vshufps_avx(auVar100,auVar100,0);
                  auVar139 = vshufps_avx(auVar100,auVar100,0x55);
                  auVar141._0_4_ = auVar90._0_4_ * auVar174._0_4_ + auVar209._0_4_ * auVar139._0_4_;
                  auVar141._4_4_ = auVar90._4_4_ * auVar174._4_4_ + auVar209._4_4_ * auVar139._4_4_;
                  auVar141._8_4_ = auVar90._8_4_ * auVar174._8_4_ + auVar209._8_4_ * auVar139._8_4_;
                  auVar141._12_4_ =
                       auVar90._12_4_ * auVar174._12_4_ + auVar209._12_4_ * auVar139._12_4_;
                  auVar72 = vsubps_avx(auVar72,auVar141);
                  auVar142._8_4_ = 0x7fffffff;
                  auVar142._0_8_ = 0x7fffffff7fffffff;
                  auVar142._12_4_ = 0x7fffffff;
                  auVar174 = vandps_avx(auVar100,auVar142);
                  auVar139 = vshufps_avx(auVar174,auVar174,0xf5);
                  auVar174 = vmaxss_avx(auVar139,auVar174);
                  if (auVar174._0_4_ < fVar71) {
                    fVar110 = auVar72._0_4_;
                    if ((fVar110 < 0.0) || (1.0 < fVar110)) break;
                    auVar90 = vmovshdup_avx(auVar72);
                    fVar112 = auVar90._0_4_;
                    if ((fVar112 < 0.0) || (1.0 < fVar112)) break;
                    auVar90 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar258 = vinsertps_avx(auVar90,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar90 = vdpps_avx(auVar258,local_380,0x7f);
                    auVar209 = vdpps_avx(auVar258,local_390,0x7f);
                    auVar174 = vdpps_avx(auVar258,local_3a0,0x7f);
                    auVar139 = vdpps_avx(auVar258,local_3b0,0x7f);
                    auVar127 = vdpps_avx(auVar258,local_3c0,0x7f);
                    auVar160 = vdpps_avx(auVar258,local_3d0,0x7f);
                    auVar128 = vdpps_avx(auVar258,local_3e0,0x7f);
                    auVar258 = vdpps_avx(auVar258,local_3f0,0x7f);
                    fVar201 = 1.0 - fVar112;
                    fVar223 = 1.0 - fVar110;
                    fVar178 = auVar72._4_4_;
                    fVar194 = auVar72._8_4_;
                    fVar196 = auVar72._12_4_;
                    fVar198 = fVar223 * fVar110 * fVar110 * 3.0;
                    auVar270._0_4_ = fVar110 * fVar110 * fVar110;
                    auVar270._4_4_ = fVar178 * fVar178 * fVar178;
                    auVar270._8_4_ = fVar194 * fVar194 * fVar194;
                    auVar270._12_4_ = fVar196 * fVar196 * fVar196;
                    fVar194 = fVar223 * fVar223 * fVar110 * 3.0;
                    fVar196 = fVar223 * fVar223 * fVar223;
                    fVar178 = fVar196 * (fVar201 * auVar90._0_4_ + fVar112 * auVar127._0_4_) +
                              (fVar201 * auVar209._0_4_ + auVar160._0_4_ * fVar112) * fVar194 +
                              fVar198 * (auVar128._0_4_ * fVar112 + fVar201 * auVar174._0_4_) +
                              auVar270._0_4_ * (fVar201 * auVar139._0_4_ + fVar112 * auVar258._0_4_)
                    ;
                    if (((fVar178 < fVar115) ||
                        (fVar201 = *(float *)(ray + k * 4 + 0x100), fVar201 < fVar178)) ||
                       (pGVar8 = (context->scene->geometries).items[uVar62].ptr,
                       (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                    auStack_f0 = vshufps_avx(auVar72,auVar72,0x55);
                    auVar298._8_4_ = 0x3f800000;
                    auVar298._0_8_ = 0x3f8000003f800000;
                    auVar298._12_4_ = 0x3f800000;
                    auVar90 = vsubps_avx(auVar298,auStack_f0);
                    fVar225 = auStack_f0._0_4_;
                    fVar228 = auStack_f0._4_4_;
                    fVar224 = auStack_f0._8_4_;
                    fVar226 = auStack_f0._12_4_;
                    fVar229 = auVar90._0_4_;
                    fVar113 = auVar90._4_4_;
                    fVar114 = auVar90._8_4_;
                    fVar200 = auVar90._12_4_;
                    auVar317._0_4_ =
                         fVar225 * (float)local_490._0_4_ + fVar229 * (float)local_470._0_4_;
                    auVar317._4_4_ =
                         fVar228 * (float)local_490._4_4_ + fVar113 * (float)local_470._4_4_;
                    auVar317._8_4_ = fVar224 * fStack_488 + fVar114 * fStack_468;
                    auVar317._12_4_ = fVar226 * fStack_484 + fVar200 * fStack_464;
                    auVar324._0_4_ = fVar225 * (float)local_4a0._0_4_ + fVar229 * fVar230;
                    auVar324._4_4_ = fVar228 * (float)local_4a0._4_4_ + fVar113 * fVar244;
                    auVar324._8_4_ = fVar224 * fStack_498 + fVar114 * fVar195;
                    auVar324._12_4_ = fVar226 * fStack_494 + fVar200 * fVar199;
                    auVar334._0_4_ = fVar225 * local_4b0 + fVar229 * (float)local_480._0_4_;
                    auVar334._4_4_ = fVar228 * fStack_4ac + fVar113 * (float)local_480._4_4_;
                    auVar334._8_4_ = fVar224 * fStack_4a8 + fVar114 * fStack_478;
                    auVar334._12_4_ = fVar226 * fStack_4a4 + fVar200 * fStack_474;
                    auVar299._0_4_ = fVar225 * (float)local_4c0._0_4_ + fVar229 * fVar242;
                    auVar299._4_4_ = fVar228 * (float)local_4c0._4_4_ + fVar113 * fVar111;
                    auVar299._8_4_ = fVar224 * fStack_4b8 + fVar114 * fVar197;
                    auVar299._12_4_ = fVar226 * fStack_4b4 + fVar200 * fVar202;
                    auVar139 = vsubps_avx(auVar324,auVar317);
                    auVar127 = vsubps_avx(auVar334,auVar324);
                    auVar160 = vsubps_avx(auVar299,auVar334);
                    auStack_110 = vshufps_avx(auVar72,auVar72,0);
                    fVar226 = auStack_110._0_4_;
                    fVar229 = auStack_110._4_4_;
                    fVar113 = auStack_110._8_4_;
                    fVar114 = auStack_110._12_4_;
                    auVar90 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                    fVar223 = auVar90._0_4_;
                    fVar225 = auVar90._4_4_;
                    fVar228 = auVar90._8_4_;
                    fVar224 = auVar90._12_4_;
                    auVar90 = vshufps_avx(auVar270,auVar270,0);
                    auVar209 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
                    auVar174 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
                    auVar256._0_4_ =
                         (fVar223 * (fVar223 * auVar139._0_4_ + fVar226 * auVar127._0_4_) +
                         fVar226 * (fVar223 * auVar127._0_4_ + fVar226 * auVar160._0_4_)) * 3.0;
                    auVar256._4_4_ =
                         (fVar225 * (fVar225 * auVar139._4_4_ + fVar229 * auVar127._4_4_) +
                         fVar229 * (fVar225 * auVar127._4_4_ + fVar229 * auVar160._4_4_)) * 3.0;
                    auVar256._8_4_ =
                         (fVar228 * (fVar228 * auVar139._8_4_ + fVar113 * auVar127._8_4_) +
                         fVar113 * (fVar228 * auVar127._8_4_ + fVar113 * auVar160._8_4_)) * 3.0;
                    auVar256._12_4_ =
                         (fVar224 * (fVar224 * auVar139._12_4_ + fVar114 * auVar127._12_4_) +
                         fVar114 * (fVar224 * auVar127._12_4_ + fVar114 * auVar160._12_4_)) * 3.0;
                    auVar139 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
                    auVar219._0_4_ =
                         auVar139._0_4_ * (float)local_410._0_4_ +
                         auVar174._0_4_ * (float)local_420._0_4_ +
                         auVar90._0_4_ * (float)local_440._0_4_ +
                         auVar209._0_4_ * (float)local_430._0_4_;
                    auVar219._4_4_ =
                         auVar139._4_4_ * (float)local_410._4_4_ +
                         auVar174._4_4_ * (float)local_420._4_4_ +
                         auVar90._4_4_ * (float)local_440._4_4_ +
                         auVar209._4_4_ * (float)local_430._4_4_;
                    auVar219._8_4_ =
                         auVar139._8_4_ * fStack_408 +
                         auVar174._8_4_ * fStack_418 +
                         auVar90._8_4_ * fStack_438 + auVar209._8_4_ * fStack_428;
                    auVar219._12_4_ =
                         auVar139._12_4_ * fStack_404 +
                         auVar174._12_4_ * fStack_414 +
                         auVar90._12_4_ * fStack_434 + auVar209._12_4_ * fStack_424;
                    auVar90 = vshufps_avx(auVar256,auVar256,0xc9);
                    auVar239._0_4_ = auVar219._0_4_ * auVar90._0_4_;
                    auVar239._4_4_ = auVar219._4_4_ * auVar90._4_4_;
                    auVar239._8_4_ = auVar219._8_4_ * auVar90._8_4_;
                    auVar239._12_4_ = auVar219._12_4_ * auVar90._12_4_;
                    auVar90 = vshufps_avx(auVar219,auVar219,0xc9);
                    auVar220._0_4_ = auVar256._0_4_ * auVar90._0_4_;
                    auVar220._4_4_ = auVar256._4_4_ * auVar90._4_4_;
                    auVar220._8_4_ = auVar256._8_4_ * auVar90._8_4_;
                    auVar220._12_4_ = auVar256._12_4_ * auVar90._12_4_;
                    auVar90 = vsubps_avx(auVar220,auVar239);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar178;
                      uVar4 = vextractps_avx(auVar90,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                      uVar4 = vextractps_avx(auVar90,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar90._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar110;
                      *(float *)(ray + k * 4 + 0x200) = fVar112;
                      *(uint *)(ray + k * 4 + 0x220) = uVar7;
                      *(uint *)(ray + k * 4 + 0x240) = uVar62;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auStack_170 = vshufps_avx(auVar90,auVar90,0x55);
                    auStack_150 = vshufps_avx(auVar90,auVar90,0xaa);
                    auStack_130 = vshufps_avx(auVar90,auVar90,0);
                    local_180[0] = (RTCHitN)auStack_170[0];
                    local_180[1] = (RTCHitN)auStack_170[1];
                    local_180[2] = (RTCHitN)auStack_170[2];
                    local_180[3] = (RTCHitN)auStack_170[3];
                    local_180[4] = (RTCHitN)auStack_170[4];
                    local_180[5] = (RTCHitN)auStack_170[5];
                    local_180[6] = (RTCHitN)auStack_170[6];
                    local_180[7] = (RTCHitN)auStack_170[7];
                    local_180[8] = (RTCHitN)auStack_170[8];
                    local_180[9] = (RTCHitN)auStack_170[9];
                    local_180[10] = (RTCHitN)auStack_170[10];
                    local_180[0xb] = (RTCHitN)auStack_170[0xb];
                    local_180[0xc] = (RTCHitN)auStack_170[0xc];
                    local_180[0xd] = (RTCHitN)auStack_170[0xd];
                    local_180[0xe] = (RTCHitN)auStack_170[0xe];
                    local_180[0xf] = (RTCHitN)auStack_170[0xf];
                    local_160 = auStack_150;
                    local_140 = auStack_130;
                    local_120 = auStack_110;
                    local_100 = auStack_f0;
                    local_e0 = local_300._0_8_;
                    uStack_d8 = local_300._8_8_;
                    uStack_d0 = local_300._16_8_;
                    uStack_c8 = local_300._24_8_;
                    local_c0 = local_2e0._0_8_;
                    uStack_b8 = local_2e0._8_8_;
                    uStack_b0 = local_2e0._16_8_;
                    uStack_a8 = local_2e0._24_8_;
                    auVar102 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_84 = auVar102._28_4_;
                    uVar68 = uStack_84;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar178;
                    local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar67 & 0xf) << 4));
                    local_510 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)((int)uVar67 >> 4) * 0x10);
                    local_4f0.valid = (int *)local_520;
                    local_4f0.geometryUserPtr = pGVar8->userPtr;
                    local_4f0.context = context->user;
                    local_4f0.hit = local_180;
                    local_4f0.N = 8;
                    local_4f0.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_4f0);
                    }
                    auVar90 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                    auVar209 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                    auVar177._16_16_ = auVar209;
                    auVar177._0_16_ = auVar90;
                    auVar18 = auVar102 & ~auVar177;
                    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar18 >> 0x7f,0) != '\0') ||
                          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar18 >> 0xbf,0) != '\0') ||
                        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar18[0x1f] < '\0') {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&local_4f0);
                      }
                      auVar90 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                      auVar209 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                      auVar108._16_16_ = auVar209;
                      auVar108._0_16_ = auVar90;
                      auVar18 = auVar102 & ~auVar108;
                      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar18 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar18 >> 0x7f,0) != '\0') ||
                            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar18 >> 0xbf,0) != '\0') ||
                          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar18[0x1f] < '\0') {
                        auVar109._0_4_ = auVar90._0_4_ ^ auVar102._0_4_;
                        auVar109._4_4_ = auVar90._4_4_ ^ auVar102._4_4_;
                        auVar109._8_4_ = auVar90._8_4_ ^ auVar102._8_4_;
                        auVar109._12_4_ = auVar90._12_4_ ^ auVar102._12_4_;
                        auVar109._16_4_ = auVar209._0_4_ ^ auVar102._16_4_;
                        auVar109._20_4_ = auVar209._4_4_ ^ auVar102._20_4_;
                        auVar109._24_4_ = auVar209._8_4_ ^ auVar102._24_4_;
                        auVar109._28_4_ = auVar209._12_4_ ^ uVar68;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])local_4f0.hit);
                        *(undefined1 (*) [32])(local_4f0.ray + 0x180) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x1a0) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x1c0) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x1e0) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x200) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x220) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x240) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x260) = auVar102;
                        auVar102 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_4f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_4f0.ray + 0x280) = auVar102;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar201;
                    break;
                  }
                  lVar64 = lVar64 + -1;
                } while (lVar64 != 0);
              }
            }
          }
        }
        if (uVar70 == 0) break;
      } while( true );
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar101._4_4_ = uVar4;
    auVar101._0_4_ = uVar4;
    auVar101._8_4_ = uVar4;
    auVar101._12_4_ = uVar4;
    auVar90 = vcmpps_avx(local_450,auVar101,2);
    uVar62 = vmovmskps_avx(auVar90);
    uVar61 = uVar61 & uVar61 + 0xf & uVar62;
    auVar53 = ZEXT812(0) << 0x20;
    if (uVar61 == 0) {
      return;
    }
  } while( true );
LAB_00fbda27:
  auVar90 = vinsertps_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar110),0x10);
  auVar357 = ZEXT1664(auVar90);
  goto LAB_00fbc203;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }